

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_by_extension(REF_GRID ref_grid,char *filename)

{
  char *__s1;
  REF_INT RVar1;
  REF_GEOM pRVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_DBL *pRVar5;
  REF_SIZE RVar6;
  REF_INT RVar7;
  REF_INT RVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  REF_CELL_TYPE RVar12;
  REF_STATUS RVar13;
  size_t sVar14;
  undefined4 extraout_var;
  FILE *pFVar15;
  undefined4 extraout_var_00;
  void *pvVar16;
  long lVar17;
  REF_INT *pRVar18;
  undefined4 extraout_var_01;
  void *pvVar19;
  undefined4 extraout_var_02;
  ulong uVar20;
  undefined4 extraout_var_03;
  byte bVar21;
  REF_INT n4;
  REF_CELL *ppRVar22;
  long lVar23;
  REF_INT n3;
  uint uVar24;
  undefined8 uVar25;
  char *pcVar26;
  undefined1 *puVar27;
  FILE *next_position;
  REF_INT cell;
  REF_INT RVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  REF_CELL *ppRVar35;
  char *pcVar36;
  char *__s1_00;
  FILE *__n;
  int iVar37;
  bool bVar38;
  REF_INT RVar39;
  double dVar40;
  FILE *pFStackY_560;
  undefined8 in_stack_fffffffffffffaa8;
  undefined4 uVar41;
  FILE *local_530;
  long local_528;
  void *local_520;
  ulong local_518;
  REF_INT *o2n_4;
  REF_DBL area;
  undefined8 local_500;
  REF_INT *n2o;
  double local_4f0;
  double local_4e8;
  REF_INT keyword_code;
  REF_INT code;
  undefined4 uStack_4d4;
  FILE *local_4d0;
  REF_CELL *local_4c8;
  uint local_4bc;
  REF_INT *o2n;
  REF_INT RStack_4b0;
  REF_INT RStack_4ac;
  REF_INT RStack_4a8;
  REF_INT RStack_4a4;
  REF_INT RStack_4a0;
  REF_INT local_49c;
  REF_INT min_faceid;
  FILE *local_440;
  REF_INT nodes [27];
  
  sVar14 = strlen(filename);
  pcVar26 = filename + (sVar14 - 4);
  iVar9 = strcmp(pcVar26,".vtk");
  if (iVar9 == 0) {
    pRVar3 = ref_grid->node;
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x9b
             ,"ref_export_vtk","unable to open file");
      pFStackY_560 = (FILE *)0x2;
    }
    else {
      fwrite("# vtk DataFile Version 2.0\n",0x1b,1,local_530);
      fwrite("ref_export_vtk\n",0xf,1,local_530);
      fwrite("ASCII\n",6,1,local_530);
      uVar10 = ref_node_compact(pRVar3,&o2n,&n2o);
      if (uVar10 == 0) {
        fwrite("DATASET UNSTRUCTURED_GRID\n",0x1a,1,local_530);
        fprintf(local_530,"POINTS %d double\n",(ulong)(uint)pRVar3->n);
        for (lVar30 = 0; lVar30 < pRVar3->n; lVar30 = lVar30 + 1) {
          pRVar5 = pRVar3->real;
          lVar17 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
          fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar17 * 0xf],pRVar5[lVar17 * 0xf + 1],
                  pRVar5[lVar17 * 0xf + 2]);
        }
        ppRVar35 = ref_grid->cell + 3;
        uVar33 = 0;
        uVar31 = 0;
        for (lVar30 = 0; lVar30 != 0xd; lVar30 = lVar30 + 1) {
          iVar9 = ppRVar35[lVar30]->n;
          uVar31 = (ulong)(uint)((int)uVar31 + iVar9);
          uVar33 = (ulong)(uint)((int)uVar33 + (ppRVar35[lVar30]->node_per + 1) * iVar9);
        }
        local_4c8 = (REF_CELL *)CONCAT44(local_4c8._4_4_,(int)uVar31);
        fprintf(local_530,"CELLS %d %d\n",uVar31,uVar33);
        local_500 = ppRVar35;
        for (lVar30 = 3; lVar30 != 0x10; lVar30 = lVar30 + 1) {
          pRVar4 = *ppRVar35;
          uVar10 = pRVar4->node_per;
          iVar9 = 0;
          uVar33 = 0;
          if (0 < (int)uVar10) {
            uVar33 = (ulong)uVar10;
          }
          for (; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              fprintf(local_530," %d",uVar10);
              RVar28 = nodes[2];
              RVar1 = nodes[1];
              RVar39 = nodes[3];
              if (uVar10 == 6) {
LAB_0012050e:
                nodes[1] = nodes[0];
                nodes[0] = RVar1;
                nodes[3] = nodes[4];
                nodes[4] = RVar39;
              }
              else if (uVar10 == 5) {
                nodes[2] = nodes[3];
                RVar39 = RVar28;
                goto LAB_0012050e;
              }
              for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                fprintf(local_530," %d",(ulong)(uint)o2n[nodes[uVar31]]);
              }
              fputc(10,local_530);
            }
          }
          ppRVar35 = ref_grid->cell + lVar30 + 1;
        }
        fprintf(local_530,"CELL_TYPES %d\n",(ulong)local_4c8 & 0xffffffff);
        pRVar4 = *local_500;
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          if (pRVar4->c2n[(long)iVar9 * (long)pRVar4->size_per] != -1) {
            fprintf(local_530," %d\n",5);
          }
        }
        pRVar4 = ref_grid->cell[6];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          if (pRVar4->c2n[(long)iVar9 * (long)pRVar4->size_per] != -1) {
            fprintf(local_530," %d\n",9);
          }
        }
        pRVar4 = ref_grid->cell[8];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          if (pRVar4->c2n[(long)iVar9 * (long)pRVar4->size_per] != -1) {
            fprintf(local_530," %d\n",10);
          }
        }
        pRVar4 = ref_grid->cell[9];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          if (pRVar4->c2n[(long)iVar9 * (long)pRVar4->size_per] != -1) {
            fprintf(local_530," %d\n",0xe);
          }
        }
        pRVar4 = ref_grid->cell[10];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          if (pRVar4->c2n[(long)iVar9 * (long)pRVar4->size_per] != -1) {
            fprintf(local_530," %d\n",0xd);
          }
        }
        pRVar4 = ref_grid->cell[0xb];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          if (pRVar4->c2n[(long)iVar9 * (long)pRVar4->size_per] != -1) {
            fprintf(local_530," %d\n",0xc);
          }
        }
        goto LAB_00123714;
      }
      pFStackY_560 = (FILE *)(ulong)uVar10;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa1
             ,"ref_export_vtk",(ulong)uVar10,"compact");
    }
    pcVar26 = "vtk export failed";
    uVar25 = 0xaa0;
    goto LAB_00120b71;
  }
  pcVar36 = filename + sVar14;
  if (((pcVar36[-2] == '.') && (pcVar36[-1] == 'c')) && (*pcVar36 == '\0')) {
    pRVar3 = ref_grid->node;
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6a1,"ref_export_c","unable to open file");
      pFStackY_560 = (FILE *)0x2;
    }
    else {
      uVar10 = ref_node_compact(pRVar3,&o2n,&n2o);
      if (uVar10 == 0) {
        for (uVar33 = 0; (long)uVar33 < (long)pRVar3->n; uVar33 = uVar33 + 1) {
          fprintf(local_530,"  RSS(ref_node_add(ref_node,%d,&node),\"node\");\n",uVar33 & 0xffffffff
                 );
          for (uVar31 = 0; (int)uVar31 != 3; uVar31 = uVar31 + 1) {
            fprintf(local_530,"  ref_node_xyz(ref_node,%d,node) = %.15e;\n",
                    pRVar3->real
                    [(long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + uVar33 * 4) * 0xf + uVar31],
                    uVar31 & 0xffffffff);
          }
        }
        pRVar4 = ref_grid->cell[6];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
          if (RVar13 == 0) {
            for (uVar33 = 0; (long)uVar33 < (long)pRVar4->size_per; uVar33 = uVar33 + 1) {
              fprintf(local_530,"  nodes[%d] = %d;\n",uVar33 & 0xffffffff,
                      (ulong)(uint)o2n[nodes[uVar33]]);
            }
            fwrite("  RSS(ref_cell_add(ref_grid_qua(ref_grid),nodes,&cell),\"qua\");\n",0x3f,1,
                   local_530);
          }
        }
        goto LAB_00122db5;
      }
      pFStackY_560 = (FILE *)(ulong)uVar10;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6a3,"ref_export_c",(ulong)uVar10,"compact");
    }
    pcVar26 = "C export failed";
    uVar25 = 0xaa2;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar26,".tec");
  if (iVar9 == 0) {
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x2fa,"ref_export_tec","unable to open file");
      pFStackY_560 = (FILE *)0x2;
    }
    else {
      fwrite("title=\"tecplot refine geometry file\"\n",0x25,1,local_530);
      fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,local_530);
      pRVar3 = ref_grid->node;
      local_4d0 = (FILE *)ref_grid->cell;
      ppRVar35 = ref_grid->cell + 8;
      for (ppRVar22 = (REF_CELL *)0x8; ppRVar22 != (REF_CELL *)0x10;
          ppRVar22 = (REF_CELL *)((long)ppRVar22 + 1)) {
        pRVar4 = *ppRVar35;
        if (0 < pRVar4->n) {
          lVar30 = (long)pRVar3->max;
          if (lVar30 < 0) {
            pcVar26 = "malloc o2n of REF_INT negative";
            uVar25 = 0x2ac;
LAB_00120aee:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,uVar25,"ref_export_tec_vol_zone",pcVar26);
            pFStackY_560 = (FILE *)0x1;
          }
          else {
            uVar10 = pRVar4->node_per;
            local_4c8 = ppRVar22;
            pvVar16 = malloc(lVar30 * 4);
            if (pvVar16 == (void *)0x0) {
              pcVar26 = "malloc o2n of REF_INT NULL";
              uVar25 = 0x2ac;
            }
            else {
              for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
                *(undefined4 *)((long)pvVar16 + lVar17 * 4) = 0xffffffff;
              }
              iVar9 = 0;
              local_500 = (REF_CELL *)CONCAT44(local_500._4_4_,uVar10);
              uVar33 = 0;
              if (0 < (int)uVar10) {
                uVar33 = (ulong)uVar10;
              }
              iVar29 = 0;
              for (; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                if (RVar13 == 0) {
                  for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                    if (*(int *)((long)pvVar16 + (long)nodes[uVar31] * 4) == -1) {
                      *(int *)((long)pvVar16 + (long)nodes[uVar31] * 4) = iVar29;
                      iVar29 = iVar29 + 1;
                    }
                  }
                }
              }
              uVar31 = 0;
              uVar33 = (ulong)(uint)pRVar3->max;
              if (pRVar3->max < 1) {
                uVar33 = uVar31;
              }
              uVar10 = 0;
              for (; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                if (*(int *)((long)pvVar16 + uVar31 * 4) != -1) {
                  *(uint *)((long)pvVar16 + uVar31 * 4) = uVar10;
                  uVar10 = uVar10 + 1;
                }
              }
              if ((int)uVar10 < 0) {
                pcVar26 = "malloc n2o of REF_INT negative";
                uVar25 = 0x2c3;
                goto LAB_00120aee;
              }
              pvVar19 = malloc((ulong)uVar10 * 4);
              if (pvVar19 != (void *)0x0) {
                for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                  lVar30 = (long)*(int *)((long)pvVar16 + uVar31 * 4);
                  if (lVar30 != -1) {
                    *(int *)((long)pvVar19 + lVar30 * 4) = (int)uVar31;
                  }
                }
                fprintf(local_530,
                        "zone t=\"e%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                        (ulong)local_500 & 0xffffffff,(ulong)uVar10,(ulong)(uint)pRVar4->n,"point",
                        "febrick");
                for (uVar33 = 0; uVar10 != uVar33; uVar33 = uVar33 + 1) {
                  pRVar5 = pRVar3->real;
                  lVar30 = (long)*(int *)((long)pvVar19 + uVar33 * 4);
                  fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar30 * 0xf],
                          pRVar5[lVar30 * 0xf + 1],pRVar5[lVar30 * 0xf + 2]);
                }
                for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                  RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                  if (RVar13 != 0) goto LAB_0012029e;
                  switch(pRVar4->node_per) {
                  case 4:
                    RStack_4b0 = nodes[2];
                    RStack_4ac = nodes[2];
                    RStack_4a8 = nodes[3];
                    RStack_4a4 = nodes[3];
                    local_49c = nodes[3];
                    goto LAB_0012025c;
                  case 5:
                    RStack_4b0 = nodes[2];
                    RStack_4ac = nodes[2];
                    RStack_4a8 = nodes[3];
                    RStack_4a4 = nodes[4];
                    RStack_4a0 = nodes[4];
                    local_49c = nodes[3];
                    break;
                  case 6:
                    RStack_4b0 = nodes[2];
                    RStack_4ac = nodes[2];
                    RStack_4a4 = nodes[4];
                    local_49c = nodes[5];
LAB_0012025c:
                    RStack_4a8 = nodes[3];
                    RStack_4b0 = nodes[2];
                    RStack_4a0 = local_49c;
                    RStack_4ac = RStack_4b0;
                    break;
                  default:
                    pFStackY_560 = (FILE *)0x6;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x2e2,"ref_export_tec_vol_zone",6,"wrong nodes per cell");
                    goto LAB_00120b25;
                  case 8:
                    RStack_4ac = nodes[3];
                    RStack_4a8 = nodes[4];
                    RStack_4a4 = nodes[5];
                    RStack_4a0 = nodes[6];
                    local_49c = nodes[7];
                  }
                  o2n = (REF_INT *)CONCAT44(nodes[1],nodes[0]);
                  RStack_4b0 = nodes[2];
                  for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
                    fprintf(local_530," %d",
                            (ulong)(*(int *)((long)pvVar16 +
                                            (long)*(int *)((long)&o2n + lVar30 * 4) * 4) + 1));
                  }
                  fputc(10,local_530);
LAB_0012029e:
                }
                free(pvVar19);
                free(pvVar16);
                ppRVar22 = local_4c8;
                goto LAB_001202c5;
              }
              pcVar26 = "malloc n2o of REF_INT NULL";
              uVar25 = 0x2c3;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,uVar25,"ref_export_tec_vol_zone",pcVar26);
            pFStackY_560 = (FILE *)0x2;
          }
LAB_00120b25:
          pcVar26 = "vol";
          uVar25 = 0x2ff;
          goto LAB_00120b46;
        }
LAB_001202c5:
        ppRVar35 = (REF_CELL *)(local_4d0->_shortbuf + (long)ppRVar22 * 8 + -0x7b);
      }
      uVar10 = ref_export_tec_surf_zone(ref_grid,(FILE *)local_530);
      if (uVar10 == 0) {
        pRVar3 = ref_grid->node;
        uVar10 = ref_dict_create((REF_DICT *)&o2n_4);
        if (uVar10 == 0) {
          pRVar4 = ref_grid->cell[4];
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if ((RVar13 == 0) &&
               (uVar10 = ref_dict_store((REF_DICT)o2n_4,nodes[pRVar4->node_per],-1), uVar10 != 0)) {
              pFStackY_560 = (FILE *)(ulong)uVar10;
              pcVar26 = "mark tri";
              uVar25 = 0x1e3;
              goto LAB_00120d33;
            }
          }
          iVar9 = *o2n_4;
          uVar10 = 0xffffffff;
          if (0 < iVar9) {
            uVar10 = **(uint **)(o2n_4 + 4);
          }
          lVar30 = 0;
          while (lVar17 = lVar30, lVar17 < iVar9) {
            uVar24 = ref_grid_cell_id_nodes(ref_grid,pRVar4,uVar10,(REF_INT *)&area,&code,&o2n,&n2o)
            ;
            if (uVar24 != 0) {
              pFStackY_560 = (FILE *)(ulong)uVar24;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x1e8,"ref_export_tec_tr2_zone",(ulong)uVar24,"extract this tri");
              goto LAB_00120d3d;
            }
            fprintf(local_530,
                    "zone t=\"p2face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)uVar10,(ulong)area._0_4_,(ulong)(uint)(code << 2),"point","fetriangle");
            for (lVar30 = 0; lVar30 < (int)area._0_4_; lVar30 = lVar30 + 1) {
              pRVar5 = pRVar3->real;
              lVar23 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
              fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar23 * 0xf],pRVar5[lVar23 * 0xf + 1]
                      ,pRVar5[lVar23 * 0xf + 2]);
            }
            for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
              if ((RVar13 == 0) && (uVar10 == nodes[pRVar4->node_per])) {
                fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[0]] + 1),
                        (ulong)(o2n[nodes[3]] + 1),(ulong)(o2n[nodes[5]] + 1));
                fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[1]] + 1),
                        (ulong)(o2n[nodes[4]] + 1),(ulong)(o2n[nodes[3]] + 1));
                fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[2]] + 1),
                        (ulong)(o2n[nodes[5]] + 1),(ulong)(o2n[nodes[4]] + 1));
                fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[3]] + 1),
                        (ulong)(o2n[nodes[4]] + 1),(ulong)(o2n[nodes[5]] + 1));
              }
            }
            free((void *)CONCAT44(n2o._4_4_,(int)n2o));
            free(o2n);
            lVar30 = lVar17 + 1;
            iVar9 = *o2n_4;
            uVar10 = 0xffffffff;
            if ((int)lVar30 < iVar9) {
              uVar10 = *(uint *)(*(long *)(o2n_4 + 4) + 4 + lVar17 * 4);
            }
          }
          uVar10 = ref_dict_free((REF_DICT)o2n_4);
          if (uVar10 == 0) {
            pRVar3 = ref_grid->node;
            uVar10 = ref_dict_create((REF_DICT *)&o2n_4);
            if (uVar10 == 0) {
              pRVar4 = ref_grid->cell[5];
              for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                if ((RVar13 == 0) &&
                   (uVar10 = ref_dict_store((REF_DICT)o2n_4,nodes[pRVar4->node_per],-1), uVar10 != 0
                   )) {
                  pFStackY_560 = (FILE *)(ulong)uVar10;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x21f,"ref_export_tec_tr3_zone",(ulong)uVar10,"mark tri");
                  goto LAB_00121795;
                }
              }
              iVar9 = *o2n_4;
              uVar10 = 0xffffffff;
              if (0 < iVar9) {
                uVar10 = **(uint **)(o2n_4 + 4);
              }
              lVar30 = 0;
              while (lVar17 = lVar30, lVar17 < iVar9) {
                uVar24 = ref_grid_cell_id_nodes
                                   (ref_grid,pRVar4,uVar10,(REF_INT *)&area,&code,&o2n,&n2o);
                if (uVar24 != 0) {
                  pFStackY_560 = (FILE *)(ulong)uVar24;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x224,"ref_export_tec_tr3_zone",(ulong)uVar24,"extract this tri");
                  goto LAB_00121795;
                }
                fprintf(local_530,
                        "zone t=\"p3face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                        (ulong)uVar10,(ulong)area._0_4_,(ulong)(uint)(code * 9),"point","fetriangle"
                       );
                for (lVar30 = 0; lVar30 < (int)area._0_4_; lVar30 = lVar30 + 1) {
                  pRVar5 = pRVar3->real;
                  lVar23 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
                  fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar23 * 0xf],
                          pRVar5[lVar23 * 0xf + 1],pRVar5[lVar23 * 0xf + 2]);
                }
                for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                  RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                  if ((RVar13 == 0) && (uVar10 == nodes[pRVar4->node_per])) {
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[0]] + 1),
                            (ulong)(o2n[nodes[3]] + 1),(ulong)(o2n[nodes[8]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[8]] + 1),
                            (ulong)(o2n[nodes[3]] + 1),(ulong)(o2n[nodes[9]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[1]] + 1),
                            (ulong)(o2n[nodes[5]] + 1),(ulong)(o2n[nodes[4]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[4]] + 1),
                            (ulong)(o2n[nodes[5]] + 1),(ulong)(o2n[nodes[9]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[2]] + 1),
                            (ulong)(o2n[nodes[7]] + 1),(ulong)(o2n[nodes[6]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[6]] + 1),
                            (ulong)(o2n[nodes[7]] + 1),(ulong)(o2n[nodes[9]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[9]] + 1),
                            (ulong)(o2n[nodes[5]] + 1),(ulong)(o2n[nodes[6]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[9]] + 1),
                            (ulong)(o2n[nodes[7]] + 1),(ulong)(o2n[nodes[8]] + 1));
                    fprintf(local_530," %d %d %d\n",(ulong)(o2n[nodes[9]] + 1),
                            (ulong)(o2n[nodes[3]] + 1),(ulong)(o2n[nodes[4]] + 1));
                  }
                }
                free((void *)CONCAT44(n2o._4_4_,(int)n2o));
                free(o2n);
                lVar30 = lVar17 + 1;
                iVar9 = *o2n_4;
                uVar10 = 0xffffffff;
                if ((int)lVar30 < iVar9) {
                  uVar10 = *(uint *)(*(long *)(o2n_4 + 4) + 4 + lVar17 * 4);
                }
              }
              uVar10 = ref_dict_free((REF_DICT)o2n_4);
              if (uVar10 == 0) {
                pRVar3 = ref_grid->node;
                uVar10 = ref_dict_create((REF_DICT *)&o2n_4);
                pFStackY_560 = (FILE *)(ulong)uVar10;
                if (uVar10 == 0) {
                  pRVar4 = *(REF_CELL *)local_4d0;
                  for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                    RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                    if (RVar13 == 0) {
                      uVar10 = ref_dict_store((REF_DICT)o2n_4,nodes[pRVar4->node_per],-1);
                      pFStackY_560 = (FILE *)(ulong)uVar10;
                      if (uVar10 != 0) {
                        pcVar26 = "mark tri";
                        uVar25 = 0xf3;
                        goto LAB_00123202;
                      }
                    }
                  }
                  iVar9 = *o2n_4;
                  uVar10 = 0xffffffff;
                  if (0 < iVar9) {
                    uVar10 = **(uint **)(o2n_4 + 4);
                  }
                  lVar30 = 0;
                  while (lVar17 = lVar30, lVar17 < iVar9) {
                    uVar24 = ref_grid_cell_id_nodes
                                       (ref_grid,pRVar4,uVar10,(REF_INT *)&area,&code,&o2n,&n2o);
                    pFStackY_560 = (FILE *)(ulong)uVar24;
                    if (uVar24 != 0) {
                      pcVar26 = "extract this edge";
                      uVar25 = 0xf9;
                      goto LAB_00123202;
                    }
                    fprintf(local_530,
                            "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)uVar10,(ulong)area._0_4_,(ulong)(uint)code,"point","felineseg");
                    for (lVar30 = 0; lVar30 < (int)area._0_4_; lVar30 = lVar30 + 1) {
                      pRVar5 = pRVar3->real;
                      lVar23 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
                      fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar23 * 0xf],
                              pRVar5[lVar23 * 0xf + 1],pRVar5[lVar23 * 0xf + 2]);
                    }
                    for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                      RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                      if ((RVar13 == 0) &&
                         (uVar33 = (ulong)pRVar4->node_per, uVar10 == nodes[uVar33])) {
                        for (lVar30 = 0; lVar30 < (int)uVar33; lVar30 = lVar30 + 1) {
                          fprintf(local_530," %d",(ulong)(o2n[nodes[lVar30]] + 1));
                          uVar33 = (ulong)(uint)pRVar4->node_per;
                        }
                        fputc(10,local_530);
                      }
                    }
                    free((void *)CONCAT44(n2o._4_4_,(int)n2o));
                    free(o2n);
                    lVar30 = lVar17 + 1;
                    iVar9 = *o2n_4;
                    uVar10 = 0xffffffff;
                    if ((int)lVar30 < iVar9) {
                      uVar10 = *(uint *)(*(long *)(o2n_4 + 4) + 4 + lVar17 * 4);
                    }
                  }
                  uVar10 = ref_dict_free((REF_DICT)o2n_4);
                  pFStackY_560 = (FILE *)(ulong)uVar10;
                  if (uVar10 == 0) {
                    pRVar3 = ref_grid->node;
                    uVar10 = ref_dict_create((REF_DICT *)&o2n_4);
                    pFStackY_560 = (FILE *)(ulong)uVar10;
                    if (uVar10 == 0) {
                      pRVar4 = ref_grid->cell[1];
                      for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                        RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                        if (RVar13 == 0) {
                          uVar10 = ref_dict_store((REF_DICT)o2n_4,nodes[pRVar4->node_per],-1);
                          pFStackY_560 = (FILE *)(ulong)uVar10;
                          if (uVar10 != 0) {
                            pcVar26 = "mark tri";
                            uVar25 = 300;
                            goto LAB_00124fdb;
                          }
                        }
                      }
                      iVar9 = *o2n_4;
                      uVar10 = 0xffffffff;
                      if (0 < iVar9) {
                        uVar10 = **(uint **)(o2n_4 + 4);
                      }
                      lVar30 = 0;
                      while (lVar17 = lVar30, lVar17 < iVar9) {
                        uVar24 = ref_grid_cell_id_nodes
                                           (ref_grid,pRVar4,uVar10,(REF_INT *)&area,&code,&o2n,&n2o)
                        ;
                        pFStackY_560 = (FILE *)(ulong)uVar24;
                        if (uVar24 != 0) {
                          pcVar26 = "extract this edge";
                          uVar25 = 0x132;
                          goto LAB_00124fdb;
                        }
                        fprintf(local_530,
                                "zone t=\"p2edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                ,(ulong)uVar10,(ulong)area._0_4_,(ulong)(uint)(code * 2),"point",
                                "felineseg");
                        for (lVar30 = 0; lVar30 < (int)area._0_4_; lVar30 = lVar30 + 1) {
                          pRVar5 = pRVar3->real;
                          lVar23 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
                          fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar23 * 0xf],
                                  pRVar5[lVar23 * 0xf + 1],pRVar5[lVar23 * 0xf + 2]);
                        }
                        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                          RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                          if ((RVar13 == 0) && (uVar10 == nodes[pRVar4->node_per])) {
                            fprintf(local_530," %d %d\n",(ulong)(o2n[nodes[0]] + 1),
                                    (ulong)(o2n[nodes[2]] + 1));
                            fprintf(local_530," %d %d\n",(ulong)(o2n[nodes[2]] + 1),
                                    (ulong)(o2n[nodes[1]] + 1));
                          }
                        }
                        free((void *)CONCAT44(n2o._4_4_,(int)n2o));
                        free(o2n);
                        lVar30 = lVar17 + 1;
                        iVar9 = *o2n_4;
                        uVar10 = 0xffffffff;
                        if ((int)lVar30 < iVar9) {
                          uVar10 = *(uint *)(*(long *)(o2n_4 + 4) + 4 + lVar17 * 4);
                        }
                      }
                      uVar10 = ref_dict_free((REF_DICT)o2n_4);
                      pFStackY_560 = (FILE *)(ulong)uVar10;
                      if (uVar10 == 0) {
                        pRVar3 = ref_grid->node;
                        uVar10 = ref_dict_create((REF_DICT *)&o2n_4);
                        pFStackY_560 = (FILE *)(ulong)uVar10;
                        if (uVar10 == 0) {
                          pRVar4 = ref_grid->cell[2];
                          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                            if (RVar13 == 0) {
                              uVar10 = ref_dict_store((REF_DICT)o2n_4,nodes[pRVar4->node_per],-1);
                              pFStackY_560 = (FILE *)(ulong)uVar10;
                              if (uVar10 != 0) {
                                pcVar26 = "mark tri";
                                uVar25 = 0x163;
                                goto LAB_001255d1;
                              }
                            }
                          }
                          iVar9 = *o2n_4;
                          uVar10 = 0xffffffff;
                          if (0 < iVar9) {
                            uVar10 = **(uint **)(o2n_4 + 4);
                          }
                          lVar30 = 0;
                          while (lVar17 = lVar30, lVar17 < iVar9) {
                            uVar24 = ref_grid_cell_id_nodes
                                               (ref_grid,pRVar4,uVar10,(REF_INT *)&area,&code,&o2n,
                                                &n2o);
                            pFStackY_560 = (FILE *)(ulong)uVar24;
                            if (uVar24 != 0) {
                              pcVar26 = "extract this edge";
                              uVar25 = 0x169;
                              goto LAB_001255d1;
                            }
                            fprintf(local_530,
                                    "zone t=\"p3edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                    ,(ulong)uVar10,(ulong)area._0_4_,(ulong)(uint)(code * 3),"point"
                                    ,"felineseg");
                            for (lVar30 = 0; lVar30 < (int)area._0_4_; lVar30 = lVar30 + 1) {
                              pRVar5 = pRVar3->real;
                              lVar23 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
                              fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar23 * 0xf],
                                      pRVar5[lVar23 * 0xf + 1],pRVar5[lVar23 * 0xf + 2]);
                            }
                            for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                              RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                              if ((RVar13 == 0) && (uVar10 == nodes[pRVar4->node_per])) {
                                fprintf(local_530," %d %d\n",(ulong)(o2n[nodes[0]] + 1),
                                        (ulong)(o2n[nodes[2]] + 1));
                                fprintf(local_530," %d %d\n",(ulong)(o2n[nodes[2]] + 1),
                                        (ulong)(o2n[nodes[3]] + 1));
                                fprintf(local_530," %d %d\n",(ulong)(o2n[nodes[3]] + 1),
                                        (ulong)(o2n[nodes[1]] + 1));
                              }
                            }
                            free((void *)CONCAT44(n2o._4_4_,(int)n2o));
                            free(o2n);
                            lVar30 = lVar17 + 1;
                            iVar9 = *o2n_4;
                            uVar10 = 0xffffffff;
                            if ((int)lVar30 < iVar9) {
                              uVar10 = *(uint *)(*(long *)(o2n_4 + 4) + 4 + lVar17 * 4);
                            }
                          }
                          uVar10 = ref_dict_free((REF_DICT)o2n_4);
                          pFStackY_560 = (FILE *)(ulong)uVar10;
                          if (uVar10 == 0) goto LAB_0012372e;
                          pcVar26 = "free dict";
                          uVar25 = 0x182;
                        }
                        else {
                          pcVar26 = "create dict";
                          uVar25 = 0x15e;
                        }
LAB_001255d1:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,uVar25,"ref_export_tec_ed3_zone",pFStackY_560,pcVar26);
                        pcVar26 = "ed3";
                        uVar25 = 0x305;
                        goto LAB_00120b46;
                      }
                      pcVar26 = "free dict";
                      uVar25 = 0x14a;
                    }
                    else {
                      pcVar26 = "create dict";
                      uVar25 = 0x127;
                    }
LAB_00124fdb:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,uVar25,"ref_export_tec_ed2_zone",pFStackY_560,pcVar26);
                    pcVar26 = "ed2";
                    uVar25 = 0x304;
                    goto LAB_00120b46;
                  }
                  pcVar26 = "free dict";
                  uVar25 = 0x113;
                }
                else {
                  pcVar26 = "create dict";
                  uVar25 = 0xee;
                }
LAB_00123202:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,uVar25,"ref_export_tec_edg_zone",pFStackY_560,pcVar26);
                pcVar26 = "edg";
                uVar25 = 0x303;
                goto LAB_00120b46;
              }
              pFStackY_560 = (FILE *)(ulong)uVar10;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x24f,"ref_export_tec_tr3_zone",(ulong)uVar10,"free dict");
            }
            else {
              pFStackY_560 = (FILE *)(ulong)uVar10;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x21a,"ref_export_tec_tr3_zone",(ulong)uVar10,"create dict");
            }
LAB_00121795:
            pcVar26 = "tr3";
            uVar25 = 0x302;
            goto LAB_00120b46;
          }
          pFStackY_560 = (FILE *)(ulong)uVar10;
          pcVar26 = "free dict";
          uVar25 = 0x206;
        }
        else {
          pFStackY_560 = (FILE *)(ulong)uVar10;
          pcVar26 = "create dict";
          uVar25 = 0x1de;
        }
LAB_00120d33:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_tec_tr2_zone",pFStackY_560,pcVar26);
LAB_00120d3d:
        pcVar26 = "tr2";
        uVar25 = 0x301;
      }
      else {
        pFStackY_560 = (FILE *)(ulong)uVar10;
        pcVar26 = "surf";
        uVar25 = 0x300;
      }
LAB_00120b46:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar25,"ref_export_tec",pFStackY_560,pcVar26);
    }
    pcVar26 = "tec export failed";
    uVar25 = 0xaa4;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar26,".plt");
  if (iVar9 == 0) {
    uVar10 = ref_gather_by_extension(ref_grid,filename);
    if (uVar10 == 0) {
      return 0;
    }
    pFStackY_560 = (FILE *)(ulong)uVar10;
    pcVar26 = "plt gather failed";
    uVar25 = 0xaa6;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar26,".eps");
  if (iVar9 == 0) {
    uVar10 = ref_export_eps(ref_grid,filename);
    if (uVar10 == 0) {
      return 0;
    }
    pFStackY_560 = (FILE *)(ulong)uVar10;
    pcVar26 = "eps export failed";
    uVar25 = 0xaa8;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar26,".pdf");
  if (iVar9 == 0) {
    RStack_4a8 = 0x5f726f66;
    RStack_4a4 = 0x2e666470;
    RStack_4a0 = 0x737065;
    o2n = (REF_INT *)0x6f7078655f666572;
    RStack_4b0 = 0x745f7472;
    RStack_4ac = 0x5f706d65;
    uVar10 = ref_export_eps(ref_grid,(char *)&o2n);
    if (uVar10 == 0) {
      snprintf((char *)nodes,0x400,"epstopdf %s -o=%s",&o2n,filename);
      iVar9 = system((char *)nodes);
      if (iVar9 == 0) {
        iVar9 = remove((char *)&o2n);
        if (iVar9 == 0) {
          return 0;
        }
        pcVar26 = "temp clean up";
        uVar25 = 0x6f9;
      }
      else {
        pcVar26 = "epstopdf failed";
        uVar25 = 0x6f8;
      }
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar25,"ref_export_pdf",pcVar26,0,(long)iVar9);
      pFStackY_560 = (FILE *)0x1;
    }
    else {
      pFStackY_560 = (FILE *)(ulong)uVar10;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6f6,"ref_export_pdf",(ulong)uVar10,"temp eps");
    }
    pcVar26 = "pdf export failed";
    uVar25 = 0xaaa;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar26,".su2");
  if (iVar9 == 0) {
    pRVar3 = ref_grid->node;
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x4da,"ref_export_su2","unable to open file");
      pFStackY_560 = (FILE *)0x2;
    }
    else {
      pcVar26 = "NDIME= 2\n";
      if (ref_grid->twod == 0) {
        pcVar26 = "NDIME= 3\n";
      }
      fwrite(pcVar26,9,1,local_530);
      uVar10 = ref_node_compact(pRVar3,&n2o,&o2n_4);
      if (uVar10 == 0) {
        fprintf(local_530,"NPOIN= %d\n",(ulong)(uint)pRVar3->n);
        if (ref_grid->twod == 0) {
          for (lVar30 = 0; lVar30 < pRVar3->n; lVar30 = lVar30 + 1) {
            pRVar5 = pRVar3->real;
            lVar17 = (long)o2n_4[lVar30];
            fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar17 * 0xf],pRVar5[lVar17 * 0xf + 1],
                    pRVar5[lVar17 * 0xf + 2]);
          }
        }
        else {
          for (lVar30 = 0; lVar30 < pRVar3->n; lVar30 = lVar30 + 1) {
            fprintf(local_530," %.16e %.16e\n",pRVar3->real[(long)o2n_4[lVar30] * 0xf],
                    pRVar3->real[(long)o2n_4[lVar30] * 0xf + 1]);
          }
        }
        ppRVar35 = ref_grid->cell;
        if (ref_grid->twod == 0) {
          ppRVar22 = ref_grid->cell + 8;
          fprintf(local_530,"NELEM= %d\n",
                  (ulong)(uint)(ref_grid->cell[9]->n + ref_grid->cell[8]->n + ref_grid->cell[10]->n
                               + ref_grid->cell[0xb]->n));
          for (lVar30 = 8; lVar30 != 0x10; lVar30 = lVar30 + 1) {
            pRVar4 = *ppRVar22;
            for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar9,(REF_INT *)&o2n);
              if (RVar13 != 0) goto LAB_001214d5;
              switch(pRVar4->type) {
              case REF_CELL_EDG:
              case REF_CELL_ED2:
              case REF_CELL_ED3:
              case REF_CELL_TRI:
              case REF_CELL_TR2:
              case REF_CELL_TR3:
              case REF_CELL_QUA:
              case REF_CELL_QU2:
              case REF_CELL_TE2:
              case REF_CELL_PY2:
              case REF_CELL_PR2:
              case REF_CELL_HE2:
                pcVar26 = "3D SU2 element";
                pFStackY_560 = (FILE *)0x6;
                uVar25 = 0x53d;
                goto LAB_0012151f;
              case REF_CELL_TET:
                pcVar26 = "10";
                goto LAB_001213f6;
              case REF_CELL_PYR:
                fwrite("14",2,1,local_530);
                RVar1 = RStack_4b0;
                o2n = (REF_INT *)CONCAT44((int)o2n,(int)((ulong)o2n >> 0x20));
                RStack_4b0 = RStack_4ac;
                RStack_4ac = RStack_4a8;
                RStack_4a8 = RVar1;
                break;
              case REF_CELL_PRI:
                fwrite("13",2,1,local_530);
                RVar1 = RStack_4ac;
                o2n = (REF_INT *)CONCAT44((int)o2n,(int)((ulong)o2n >> 0x20));
                RStack_4ac = RStack_4a8;
                RStack_4a8 = RVar1;
                break;
              case REF_CELL_HEX:
                pcVar26 = "12";
LAB_001213f6:
                fwrite(pcVar26,2,1,local_530);
              }
              for (lVar17 = 0; lVar17 < pRVar4->node_per; lVar17 = lVar17 + 1) {
                fprintf(local_530," %d",
                        (ulong)*(uint *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                        (long)*(int *)((long)&o2n + lVar17 * 4) * 4));
              }
              fputc(10,local_530);
LAB_001214d5:
            }
            ppRVar22 = ppRVar35 + lVar30 + 1;
          }
        }
        else {
          ppRVar22 = ref_grid->cell + 3;
          fprintf(local_530,"NELEM= %d\n",(ulong)(uint)(ref_grid->cell[6]->n + ref_grid->cell[3]->n)
                 );
          for (lVar30 = 3; lVar30 != 8; lVar30 = lVar30 + 1) {
            pRVar4 = *ppRVar22;
            for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar9,(REF_INT *)&o2n);
              if (RVar13 == 0) {
                RVar12 = pRVar4->type;
                if (RVar12 < 0x10) {
                  iVar29 = 0x35;
                  if (RVar12 != REF_CELL_TRI) {
                    if (RVar12 != REF_CELL_QUA) {
                      pcVar26 = "2D SU2 element";
                      pFStackY_560 = (FILE *)0x6;
                      uVar25 = 0x510;
                      goto LAB_0012151f;
                    }
                    iVar29 = 0x39;
                  }
                  fputc(iVar29,local_530);
                }
                for (lVar17 = 0; lVar17 < pRVar4->node_per; lVar17 = lVar17 + 1) {
                  fprintf(local_530," %d",
                          (ulong)*(uint *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                          (long)*(int *)((long)&o2n + lVar17 * 4) * 4));
                }
                fputc(10,local_530);
              }
            }
            ppRVar22 = ppRVar35 + lVar30 + 1;
          }
        }
        if (ref_grid->twod == 0) {
          ref_export_faceid_range(ref_grid,nodes,&code);
          RVar28 = nodes[0];
          RVar1 = code;
          fprintf(local_530,"NMARK= %d\n",(ulong)((code - nodes[0]) + 1));
          for (; RVar28 <= RVar1; RVar28 = RVar28 + 1) {
            pRVar4 = ref_grid->cell[3];
            iVar9 = pRVar4->node_per;
            iVar37 = 0;
            for (iVar29 = 0; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar29,(REF_INT *)&o2n);
              if (RVar13 == 0) {
                iVar37 = iVar37 + (uint)(*(int *)((long)&o2n + (long)iVar9 * 4) == RVar28);
              }
            }
            pRVar4 = ref_grid->cell[6];
            iVar9 = pRVar4->node_per;
            iVar32 = 0;
            for (iVar29 = 0; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar29,(REF_INT *)&o2n);
              if (RVar13 == 0) {
                iVar32 = iVar32 + (uint)(*(int *)((long)&o2n + (long)iVar9 * 4) == RVar28);
              }
            }
            fprintf(local_530,"MARKER_TAG= %d\n",RVar28);
            fprintf(local_530,"MARKER_ELEMS= %d\n",(ulong)(uint)(iVar32 + iVar37));
            pRVar4 = ref_grid->cell[3];
            uVar10 = pRVar4->node_per;
            uVar33 = 0;
            iVar9 = 0;
            if (0 < (int)uVar10) {
              uVar33 = (ulong)uVar10;
              iVar9 = 0;
            }
            for (; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar9,(REF_INT *)&o2n);
              if ((RVar13 == 0) && (*(int *)((long)&o2n + (long)(int)uVar10 * 4) == RVar28)) {
                fputc(0x35,local_530);
                for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                  fprintf(local_530," %d",
                          (ulong)*(uint *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                          (long)*(int *)((long)&o2n + uVar31 * 4) * 4));
                }
                fputc(10,local_530);
              }
            }
            pRVar4 = ref_grid->cell[6];
            uVar10 = pRVar4->node_per;
            uVar33 = 0;
            iVar9 = 0;
            if (0 < (int)uVar10) {
              uVar33 = (ulong)uVar10;
              iVar9 = 0;
            }
            for (; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar9,(REF_INT *)&o2n);
              if ((RVar13 == 0) && (*(int *)((long)&o2n + (long)(int)uVar10 * 4) == RVar28)) {
                fputc(0x39,local_530);
                for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                  fprintf(local_530," %d",
                          (ulong)*(uint *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                          (long)*(int *)((long)&o2n + uVar31 * 4) * 4));
                }
                fputc(10,local_530);
              }
            }
          }
        }
        else {
          pRVar4 = *ppRVar35;
          local_528._0_4_ = -0x80000000;
          iVar9 = 0x7fffffff;
          for (iVar29 = 0; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar29,nodes);
            if (RVar13 == 0) {
              iVar37 = nodes[pRVar4->node_per];
              if (iVar37 <= iVar9) {
                iVar9 = iVar37;
              }
              if ((int)local_528 <= iVar37) {
                local_528._0_4_ = iVar37;
              }
            }
          }
          fprintf(local_530,"NMARK= %d\n",(ulong)(((int)local_528 - iVar9) + 1));
          for (; iVar9 <= (int)local_528; iVar9 = iVar9 + 1) {
            pRVar4 = *ppRVar35;
            iVar29 = pRVar4->node_per;
            uVar10 = 0;
            for (iVar37 = 0; iVar37 < pRVar4->max; iVar37 = iVar37 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar37,(REF_INT *)&o2n);
              if (RVar13 == 0) {
                uVar10 = uVar10 + (*(int *)((long)&o2n + (long)iVar29 * 4) == iVar9);
              }
            }
            fprintf(local_530,"MARKER_TAG= %d\n",iVar9);
            fprintf(local_530,"MARKER_ELEMS= %d\n",(ulong)uVar10);
            pRVar4 = *ppRVar35;
            uVar10 = pRVar4->node_per;
            uVar33 = 0;
            iVar29 = 0;
            if (0 < (int)uVar10) {
              uVar33 = (ulong)uVar10;
              iVar29 = 0;
            }
            for (; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar29,(REF_INT *)&o2n);
              if ((RVar13 == 0) && (*(int *)((long)&o2n + (long)(int)uVar10 * 4) == iVar9)) {
                fputc(0x33,local_530);
                for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                  fprintf(local_530," %d",
                          (ulong)*(uint *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                          (long)*(int *)((long)&o2n + uVar31 * 4) * 4));
                }
                fputc(10,local_530);
              }
            }
          }
        }
        free(o2n_4);
        pRVar18 = (REF_INT *)CONCAT44(n2o._4_4_,(int)n2o);
LAB_00123726:
        free(pRVar18);
        goto LAB_0012372e;
      }
      pFStackY_560 = (FILE *)(ulong)uVar10;
      pcVar26 = "compact";
      uVar25 = 0x4e2;
LAB_0012151f:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar25,"ref_export_su2",pFStackY_560,pcVar26);
    }
    pcVar26 = "su2 export failed";
    uVar25 = 0xaac;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar36 + -10,".lb8.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_export_bin_ugrid(ref_grid,filename,0,0);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar26 = "lb8.ugrid export failed";
    uVar25 = 0xaaf;
LAB_00120f4b:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar25
           ,"ref_export_by_extension",(ulong)uVar10,pcVar26);
    return uVar10;
  }
  iVar9 = strcmp(pcVar36 + -9,".b8.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_export_bin_ugrid(ref_grid,filename,1,0);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar26 = "b8.ugrid export failed";
    uVar25 = 0xab2;
    goto LAB_00120f4b;
  }
  iVar9 = strcmp(pcVar36 + -0xb,".lb8l.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_export_bin_ugrid(ref_grid,filename,0,1);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar26 = "lb8l.ugrid export failed";
    uVar25 = 0xab5;
    goto LAB_00120f4b;
  }
  iVar9 = strcmp(pcVar36 + -10,".b8l.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_export_bin_ugrid(ref_grid,filename,1,1);
    if (uVar10 == 0) {
      return 0;
    }
    pFStackY_560 = (FILE *)(ulong)uVar10;
    pcVar26 = "b8l.ugrid export failed";
    uVar25 = 0xab8;
    goto LAB_00120b71;
  }
  iVar9 = strcmp(pcVar36 + -0xc,".lb8.ugrid64");
  if (iVar9 == 0) {
    uVar10 = ref_export_bin_ugrid(ref_grid,filename,0,1);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar26 = "lb8.ugrid64 export failed";
    uVar25 = 0xabb;
    goto LAB_00120f4b;
  }
  iVar9 = strcmp(pcVar36 + -0xb,".b8.ugrid64");
  if (iVar9 == 0) {
    uVar10 = ref_export_bin_ugrid(ref_grid,filename,1,1);
    if (uVar10 == 0) {
      return 0;
    }
    pFStackY_560 = (FILE *)(ulong)uVar10;
    pcVar26 = "b8.ugrid64 export failed";
    uVar25 = 0xabe;
    goto LAB_00120b71;
  }
  __s1 = pcVar36 + -6;
  iVar9 = strcmp(__s1,".ugrid");
  uVar41 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  if (iVar9 == 0) {
    pRVar3 = ref_grid->node;
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x5b5,"ref_export_ugrid","unable to open file");
      pFStackY_560 = (FILE *)0x2;
    }
    else {
      fprintf(local_530,"%d %d %d %d %d %d %d\n",(ulong)(uint)pRVar3->n,
              (ulong)(uint)ref_grid->cell[3]->n,(ulong)(uint)ref_grid->cell[6]->n,
              (ulong)(uint)ref_grid->cell[8]->n,CONCAT44(uVar41,ref_grid->cell[9]->n),
              ref_grid->cell[10]->n,ref_grid->cell[0xb]->n);
      uVar10 = ref_node_compact(pRVar3,&o2n,&n2o);
      if (uVar10 == 0) {
        local_4c8 = ref_grid->cell;
        local_4d0 = (FILE *)(ref_grid->cell + 8);
        for (lVar30 = 0; lVar30 < pRVar3->n; lVar30 = lVar30 + 1) {
          pRVar5 = pRVar3->real;
          lVar17 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4);
          fprintf(local_530," %.16e %.16e %.16e\n",pRVar5[lVar17 * 0xf],pRVar5[lVar17 * 0xf + 1],
                  pRVar5[lVar17 * 0xf + 2]);
        }
        ref_export_faceid_range(ref_grid,(REF_INT *)&o2n_4,&code);
        RVar1 = code;
        pRVar4 = ref_grid->cell[3];
        uVar10 = pRVar4->node_per;
        uVar33 = 0;
        if (0 < (int)uVar10) {
          uVar33 = (ulong)uVar10;
        }
        local_500 = (REF_CELL *)CONCAT44(local_500._4_4_,(int)o2n_4);
        iVar9 = (int)o2n_4;
        for (iVar29 = (int)o2n_4; iVar29 <= RVar1; iVar29 = iVar29 + 1) {
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if ((RVar13 == 0) && (nodes[(int)uVar10] == iVar29)) {
              for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                fprintf(local_530," %d",(ulong)(o2n[nodes[uVar31]] + 1));
              }
              fputc(10,local_530);
            }
          }
          iVar9 = (int)local_500;
        }
        pRVar4 = ref_grid->cell[6];
        uVar10 = pRVar4->node_per;
        uVar33 = 0;
        iVar29 = iVar9;
        if (0 < (int)uVar10) {
          uVar33 = (ulong)uVar10;
        }
        for (; iVar29 <= RVar1; iVar29 = iVar29 + 1) {
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if ((RVar13 == 0) && (nodes[(int)uVar10] == iVar29)) {
              for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                fprintf(local_530," %d",(ulong)(o2n[nodes[uVar31]] + 1));
              }
              fputc(10,local_530);
            }
          }
          iVar9 = (int)local_500;
        }
        pRVar4 = ref_grid->cell[3];
        iVar29 = pRVar4->node_per;
        iVar37 = iVar9;
        for (; iVar9 <= RVar1; iVar9 = iVar9 + 1) {
          for (iVar37 = 0; iVar37 < pRVar4->max; iVar37 = iVar37 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar37,nodes);
            if ((RVar13 == 0) && (nodes[iVar29] == iVar9)) {
              fprintf(local_530," %d",(ulong)(uint)nodes[3]);
              fputc(10,local_530);
            }
          }
          iVar37 = (int)local_500;
        }
        pRVar4 = ref_grid->cell[6];
        iVar9 = pRVar4->node_per;
        for (; iVar37 <= RVar1; iVar37 = iVar37 + 1) {
          for (iVar29 = 0; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar29,nodes);
            if ((RVar13 == 0) && (nodes[iVar9] == iVar37)) {
              fprintf(local_530," %d",(ulong)(uint)nodes[4]);
              fputc(10,local_530);
            }
          }
        }
        pFVar15 = local_4d0;
        for (lVar30 = 8; lVar30 != 0x10; lVar30 = lVar30 + 1) {
          pRVar4 = *(REF_CELL *)pFVar15;
          uVar31 = 0;
          uVar33 = (ulong)(uint)pRVar4->node_per;
          if (pRVar4->node_per < 1) {
            uVar33 = uVar31;
          }
          while( true ) {
            iVar9 = (int)uVar31;
            if (pRVar4->max <= iVar9) break;
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                fprintf(local_530," %d",(ulong)(o2n[nodes[uVar31]] + 1));
              }
              fputc(10,local_530);
            }
            uVar31 = (ulong)(iVar9 + 1);
          }
          pFVar15 = (FILE *)(local_4c8 + lVar30 + 1);
        }
LAB_00123714:
        free((void *)CONCAT44(n2o._4_4_,(int)n2o));
        pRVar18 = o2n;
        goto LAB_00123726;
      }
      pFStackY_560 = (FILE *)(ulong)uVar10;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x5c4,"ref_export_ugrid",(ulong)uVar10,"compact");
    }
    pcVar26 = "ugrid export failed";
    uVar25 = 0xac0;
    goto LAB_00120b71;
  }
  __s1_00 = pcVar36 + -5;
  iVar9 = strcmp(__s1_00,".grid");
  if (iVar9 != 0) {
    iVar9 = strcmp(__s1_00,".poly");
    if (iVar9 == 0) {
      pRVar3 = ref_grid->node;
      pFVar15 = fopen(filename,"w");
      if (pFVar15 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x3ef,"ref_export_poly","unable to open file");
        pFStackY_560 = (FILE *)0x2;
      }
      else {
        fprintf(pFVar15,"%d  %d  %d  %d\n",(ulong)(uint)pRVar3->n,3,0,0);
        uVar10 = ref_node_compact(pRVar3,&o2n_4,(REF_INT **)&code);
        if (uVar10 == 0) {
          for (uVar33 = 0; (long)uVar33 < (long)pRVar3->n; uVar33 = uVar33 + 1) {
            pRVar5 = pRVar3->real;
            lVar30 = (long)*(int *)(CONCAT44(uStack_4d4,code) + uVar33 * 4);
            fprintf(pFVar15,"%d  %.16e  %.16e  %.16e\n",pRVar5[lVar30 * 0xf],
                    pRVar5[lVar30 * 0xf + 1],pRVar5[lVar30 * 0xf + 2],uVar33 & 0xffffffff);
          }
          pRVar4 = ref_grid->cell[3];
          uVar10 = pRVar4->node_per;
          fprintf(pFVar15,"%d  %d\n",(ulong)(uint)pRVar4->n,1);
          iVar9 = 0;
          while( true ) {
            if (pRVar4->max <= iVar9) break;
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              in_stack_fffffffffffffaa8 =
                   CONCAT44((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),nodes[3]);
              fprintf(pFVar15,"1 0 1\n%d  %d %d %d  %d\n",(ulong)uVar10,(ulong)(uint)o2n_4[nodes[0]]
                      ,(ulong)(uint)o2n_4[nodes[1]],(ulong)(uint)o2n_4[nodes[2]],
                      in_stack_fffffffffffffaa8);
            }
            iVar9 = iVar9 + 1;
          }
          local_4d0 = pFVar15;
          ref_export_faceid_range(ref_grid,&min_faceid,&keyword_code);
          RVar1 = keyword_code;
          local_500 = (REF_CELL *)((ulong)local_500._4_4_ << 0x20);
          local_4c8 = (REF_CELL *)CONCAT44(local_4c8._4_4_,min_faceid);
          for (RVar28 = min_faceid; RVar28 <= RVar1; RVar28 = RVar28 + 1) {
            dVar40 = -1.0;
            iVar9 = -1;
            for (iVar29 = 0; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar29,nodes);
              if ((RVar13 == 0) && (nodes[(int)uVar10] == RVar28)) {
                uVar24 = ref_node_tri_area(pRVar3,nodes,&area);
                if (uVar24 != 0) {
                  pFStackY_560 = (FILE *)(ulong)uVar24;
                  pcVar26 = "area";
                  uVar25 = 0x41a;
                  goto LAB_001229fd;
                }
                if (dVar40 < (double)CONCAT44(area._4_4_,area._0_4_)) {
                  dVar40 = (double)CONCAT44(area._4_4_,area._0_4_);
                  iVar9 = iVar29;
                }
              }
            }
            if (iVar9 != -1) {
              uVar24 = ref_cell_nodes(pRVar4,iVar9,nodes);
              if (uVar24 != 0) {
                pFStackY_560 = (FILE *)(ulong)uVar24;
                pcVar26 = "tri nodes";
                uVar25 = 0x422;
                goto LAB_001229fd;
              }
              uVar24 = ref_node_tri_normal(pRVar3,nodes,(REF_DBL *)&o2n);
              if (uVar24 != 0) {
                pFStackY_560 = (FILE *)(ulong)uVar24;
                pcVar26 = "normal";
                uVar25 = 0x423;
                goto LAB_001229fd;
              }
              uVar24 = ref_math_normalize((REF_DBL *)&o2n);
              if (uVar24 != 0) {
                pFStackY_560 = (FILE *)(ulong)uVar24;
                pcVar26 = "norm";
                uVar25 = 0x424;
                goto LAB_001229fd;
              }
              if (dVar40 < 0.0) {
                dVar40 = sqrt(dVar40);
              }
              else {
                dVar40 = SQRT(dVar40);
              }
              if (1e-12 < dVar40 * 0.0001) {
                local_500 = (REF_CELL *)CONCAT44(local_500._4_4_,(int)local_500 + 1);
              }
            }
          }
          local_4bc = 0;
          fprintf(local_4d0,"%d\n",(ulong)local_500 & 0xffffffff);
          while (local_530 = local_4d0, iVar9 = (int)local_4c8, (int)local_4c8 <= RVar1) {
            local_530 = (FILE *)0xbff0000000000000;
            iVar29 = -1;
            for (iVar37 = 0; iVar37 < pRVar4->max; iVar37 = iVar37 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar37,nodes);
              if ((RVar13 == 0) && (nodes[(int)uVar10] == iVar9)) {
                uVar24 = ref_node_tri_area(pRVar3,nodes,&area);
                if (uVar24 != 0) {
                  pFStackY_560 = (FILE *)(ulong)uVar24;
                  pcVar26 = "area";
                  uVar25 = 0x432;
                  goto LAB_001229fd;
                }
                if ((double)local_530 < (double)CONCAT44(area._4_4_,area._0_4_)) {
                  local_530 = (FILE *)CONCAT44(area._4_4_,area._0_4_);
                  iVar29 = iVar37;
                }
              }
            }
            if (iVar29 != -1) {
              uVar24 = ref_cell_nodes(pRVar4,iVar29,nodes);
              pFStackY_560 = (FILE *)(ulong)uVar24;
              if (uVar24 != 0) {
                pcVar26 = "tri nodes";
                uVar25 = 0x43a;
                goto LAB_001229fd;
              }
              uVar24 = ref_node_tri_normal(pRVar3,nodes,(REF_DBL *)&o2n);
              pFStackY_560 = (FILE *)(ulong)uVar24;
              if (uVar24 != 0) {
                pcVar26 = "normal";
                uVar25 = 0x43b;
                goto LAB_001229fd;
              }
              uVar24 = ref_math_normalize((REF_DBL *)&o2n);
              pFStackY_560 = (FILE *)(ulong)uVar24;
              if (uVar24 != 0) {
                pcVar26 = "norm";
                uVar25 = 0x43c;
                goto LAB_001229fd;
              }
              if ((double)local_530 < 0.0) {
                dVar40 = sqrt((double)local_530);
              }
              else {
                dVar40 = SQRT((double)local_530);
              }
              dVar40 = dVar40 * 0.0001;
              if (1e-12 < dVar40) {
                uVar11 = ref_node_tri_centroid(pRVar3,nodes,(REF_DBL *)&n2o);
                uVar24 = local_4bc;
                pFStackY_560 = (FILE *)(ulong)uVar11;
                if (uVar11 != 0) {
                  pcVar26 = "center";
                  uVar25 = 0x43f;
                  goto LAB_001229fd;
                }
                fprintf(local_4d0,"%d  %.16e  %.16e  %.16e\n",
                        (double)CONCAT44(n2o._4_4_,(int)n2o) - (double)o2n * dVar40,
                        local_4f0 - (double)CONCAT44(RStack_4ac,RStack_4b0) * dVar40,
                        local_4e8 - dVar40 * (double)CONCAT44(RStack_4a4,RStack_4a8),
                        (ulong)local_4bc);
                local_4bc = uVar24 + 1;
              }
            }
            local_4c8 = (REF_CELL *)CONCAT44(local_4c8._4_4_,(int)local_4c8 + 1);
          }
          fwrite("0\n",2,1,local_4d0);
          free((void *)CONCAT44(uStack_4d4,code));
          pRVar18 = o2n_4;
LAB_00122dc7:
          free(pRVar18);
LAB_0012372e:
          fclose(local_530);
          return 0;
        }
        pFStackY_560 = (FILE *)(ulong)uVar10;
        pcVar26 = "compact";
        uVar25 = 0x3f8;
LAB_001229fd:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_poly",pFStackY_560,pcVar26);
      }
      pcVar26 = "poly export failed";
      uVar25 = 0xac4;
      goto LAB_00120b71;
    }
    iVar9 = strcmp(__s1,".smesh");
    if (iVar9 == 0) {
      pRVar3 = ref_grid->node;
      local_530 = fopen(filename,"w");
      if (local_530 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x465,"ref_export_smesh","unable to open file");
        pFStackY_560 = (FILE *)0x2;
      }
      else {
        fprintf(local_530,"%d  %d  %d  %d\n",(ulong)(uint)pRVar3->n,3,0,0);
        uVar10 = ref_node_compact(pRVar3,&o2n,&n2o);
        if (uVar10 == 0) {
          for (uVar33 = 0; (long)uVar33 < (long)pRVar3->n; uVar33 = uVar33 + 1) {
            pRVar5 = pRVar3->real;
            lVar30 = (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + uVar33 * 4);
            fprintf(local_530,"%d  %.16e  %.16e  %.16e\n",pRVar5[lVar30 * 0xf],
                    pRVar5[lVar30 * 0xf + 1],pRVar5[lVar30 * 0xf + 2],uVar33 & 0xffffffff);
          }
          pRVar4 = ref_grid->cell[3];
          uVar10 = pRVar4->node_per;
          fprintf(local_530,"%d  %d\n",(ulong)(uint)pRVar4->n,1);
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              in_stack_fffffffffffffaa8 =
                   CONCAT44((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),nodes[3]);
              fprintf(local_530,"%d  %d %d %d  %d\n",(ulong)uVar10,(ulong)(uint)o2n[nodes[0]],
                      (ulong)(uint)o2n[nodes[1]],(ulong)(uint)o2n[nodes[2]],
                      in_stack_fffffffffffffaa8);
            }
          }
          fwrite("0\n0\n",4,1,local_530);
LAB_00122db5:
          free((void *)CONCAT44(n2o._4_4_,(int)n2o));
          pRVar18 = o2n;
          goto LAB_00122dc7;
        }
        pFStackY_560 = (FILE *)(ulong)uVar10;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x46f,"ref_export_smesh",(ulong)uVar10,"compact");
      }
      pcVar26 = "smesh export failed";
      uVar25 = 0xac6;
      goto LAB_00120b71;
    }
    iVar9 = strcmp(__s1,".fgrid");
    if (iVar9 == 0) {
      pRVar3 = ref_grid->node;
      local_530 = fopen(filename,"w");
      if (local_530 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x49d,"ref_export_fgrid","unable to open file");
        pFStackY_560 = (FILE *)0x2;
      }
      else {
        iVar9 = 0;
        fprintf(local_530,"%d %d %d\n",(ulong)(uint)pRVar3->n,(ulong)(uint)ref_grid->cell[3]->n,
                (ulong)(uint)ref_grid->cell[8]->n);
        uVar10 = ref_node_compact(pRVar3,&o2n,&n2o);
        if (uVar10 == 0) {
          for (; iVar9 != 3; iVar9 = iVar9 + 1) {
            for (lVar30 = 0; lVar30 < pRVar3->n; lVar30 = lVar30 + 1) {
              fprintf(local_530," %.16e\n",
                      pRVar3->real
                      [(long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4) * 0xf + (long)iVar9
                      ]);
            }
          }
          pRVar4 = ref_grid->cell[3];
          uVar10 = pRVar4->node_per;
          if (pRVar4->node_per < 1) {
            uVar10 = 0;
          }
          iVar9 = 0;
          while( true ) {
            iVar29 = pRVar4->max;
            if (iVar29 <= iVar9) break;
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              for (uVar33 = 0; uVar10 != uVar33; uVar33 = uVar33 + 1) {
                fprintf(local_530," %d",(ulong)(o2n[nodes[uVar33]] + 1));
              }
              fputc(10,local_530);
            }
            iVar9 = iVar9 + 1;
          }
          for (iVar9 = 0; iVar9 < iVar29; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              fprintf(local_530," %d",(ulong)(uint)nodes[3]);
              fputc(10,local_530);
            }
            iVar29 = pRVar4->max;
          }
          pRVar4 = ref_grid->cell[8];
          uVar10 = pRVar4->node_per;
          if (pRVar4->node_per < 1) {
            uVar10 = 0;
          }
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              for (uVar33 = 0; uVar10 != uVar33; uVar33 = uVar33 + 1) {
                fprintf(local_530," %d",(ulong)(o2n[nodes[uVar33]] + 1));
              }
              fputc(10,local_530);
            }
          }
          goto LAB_00122db5;
        }
        pFStackY_560 = (FILE *)(ulong)uVar10;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x4a7,"ref_export_fgrid",(ulong)uVar10,"compact");
      }
      pcVar26 = "fgrid export failed";
      uVar25 = 0xac8;
      goto LAB_00120b71;
    }
    iVar9 = strcmp(__s1_00,".html");
    if (iVar9 == 0) {
      pRVar3 = ref_grid->node;
      local_530 = fopen(filename,"w");
      if (local_530 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x709,"ref_export_html","unable to open file");
        pFStackY_560 = (FILE *)0x2;
      }
      else {
        uVar10 = ref_node_compact(pRVar3,&o2n,&n2o);
        pFStackY_560 = (FILE *)(ulong)uVar10;
        if (uVar10 == 0) {
          fwrite("<html>\n",7,1,local_530);
          fwrite("  <head>\n",9,1,local_530);
          fwrite("    <title>refine export</title>\n",0x21,1,local_530);
          fwrite("    <link rel=\'stylesheet\' type=\'text/css\'\n",0x2b,1,local_530);
          fwrite("          href=\'http://www.x3dom.org/download/x3dom.css\'>\n",0x3a,1,local_530);
          fwrite("    </link>\n",0xc,1,local_530);
          fwrite("    <script type=\'text/javascript\'\n",0x23,1,local_530);
          fwrite("          src=\'http://www.x3dom.org/download/x3dom.js\'>\n",0x38,1,local_530);
          fwrite("    </script>\n",0xe,1,local_530);
          fwrite("    <style>\n",0xc,1,local_530);
          fprintf(local_530,"      x3d {width:100%%;height:100%%;border:none}\n");
          fprintf(local_530,"      body {margin:0;width:100%%;height:100%%;}\n");
          fwrite("    </style>\n",0xd,1,local_530);
          fwrite("  </head>\n",10,1,local_530);
          fwrite("  <body id=\'body\'>\n",0x13,1,local_530);
          fwrite("    <a href=\"http://x3dom.org/docs/dev/navigation.html\">\n",0x39,1,local_530);
          fwrite("camera control help\n",0x14,1,local_530);
          fwrite("    </a>\n",9,1,local_530);
          fwrite("    <x3d id=\'x3d\'><scene><shape>\n",0x21,1,local_530);
          fwrite("      <IndexedLineSet coordIndex=\'\n",0x23,1,local_530);
          pRVar4 = ref_grid->cell[3];
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              for (lVar30 = 0; lVar30 < pRVar4->node_per; lVar30 = lVar30 + 1) {
                fprintf(local_530," %d",(ulong)(uint)o2n[nodes[lVar30]]);
              }
              fprintf(local_530," %d %d\n",(ulong)(uint)o2n[nodes[0]],0xffffffffffffffff);
            }
          }
          pRVar4 = ref_grid->cell[6];
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              for (lVar30 = 0; lVar30 < pRVar4->node_per; lVar30 = lVar30 + 1) {
                fprintf(local_530," %d",(ulong)(uint)o2n[nodes[lVar30]]);
              }
              fprintf(local_530," %d %d\n",(ulong)(uint)o2n[nodes[0]],0xffffffffffffffff);
            }
          }
          pRVar4 = ref_grid->cell[8];
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              in_stack_fffffffffffffaa8 =
                   CONCAT44((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),o2n[nodes[0]]);
              fprintf(local_530," %d %d %d %d %d %d %d %d\n",(ulong)(uint)o2n[nodes[0]],
                      (ulong)(uint)o2n[nodes[1]],(ulong)(uint)o2n[nodes[2]],
                      (ulong)(uint)o2n[nodes[3]],in_stack_fffffffffffffaa8,o2n[nodes[3]],
                      o2n[nodes[1]],0xffffffff);
            }
          }
          fwrite("      \' >\n",10,1,local_530);
          fwrite("      <Coordinate point=\'\n",0x1a,1,local_530);
          for (lVar30 = 0; lVar30 < pRVar3->n; lVar30 = lVar30 + 1) {
            fprintf(local_530," %.15e",
                    pRVar3->real[(long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4) * 0xf]);
            fprintf(local_530," %.15e",
                    pRVar3->real
                    [(long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4) * 0xf + 1]);
            fprintf(local_530," %.15e\n",
                    pRVar3->real
                    [(long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) + lVar30 * 4) * 0xf + 2]);
          }
          fwrite("      \' />\n",0xb,1,local_530);
          fwrite("      </IndexedLineSet>\n",0x18,1,local_530);
          fwrite("    </shape></scene></x3d>\n",0x1b,1,local_530);
          fwrite("  </body>\n",10,1,local_530);
          fwrite("</html>\n",8,1,local_530);
          goto LAB_00123714;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x70b,"ref_export_html",pFStackY_560,"compact");
      }
      pcVar26 = "html export failed";
      uVar25 = 0xaca;
      goto LAB_00120b71;
    }
    iVar9 = strcmp(__s1,".meshb");
    if (iVar9 == 0) {
      pRVar3 = ref_grid->node;
      pRVar2 = ref_grid->geom;
      min_faceid = (ref_grid->twod == 0) + 2;
      area._0_4_ = 2;
      uVar10 = ref_grid->meshb_version;
      if ((int)uVar10 < 2) {
        if (pRVar3->old_n_global < 0x989681) {
          uVar24 = 8;
          uVar11 = 1;
          local_518 = 4;
        }
        else {
          bVar38 = (ulong)pRVar3->old_n_global < 0xbebc201;
          uVar11 = (uint)bVar38;
          area._0_4_ = 4 - bVar38;
          local_518 = (ulong)((uint)!bVar38 * 4 + 4);
          uVar24 = 0xc;
        }
      }
      else {
        uVar11 = (uint)(uVar10 < 4);
        local_518 = (ulong)((uint)(uVar10 >= 4) * 4 + 4);
        uVar24 = (uint)(uVar10 != 2) * 4 + 8;
        area._0_4_ = uVar10;
      }
      local_530 = fopen(filename,"w");
      if (local_530 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x79d,"ref_export_meshb","unable to open file");
        pFStackY_560 = (FILE *)0x2;
      }
      else {
        RVar13 = ref_node_compact(pRVar3,&o2n,&n2o);
        pFStackY_560 = (FILE *)CONCAT44(extraout_var,RVar13);
        if (RVar13 != 0) {
          pcVar26 = "compact";
          uVar25 = 0x79f;
          goto LAB_001237a4;
        }
        code = 1;
        pFVar15 = (FILE *)fwrite(&code,4,1,local_530);
        if (pFVar15 == (FILE *)0x1) {
          pFVar15 = (FILE *)fwrite(&area,4,1,local_530);
          if (pFVar15 == (FILE *)0x1) {
            lVar30 = ftell(local_530);
            keyword_code = 3;
            pFVar15 = (FILE *)fwrite(&keyword_code,4,1,local_530);
            uVar10 = area._0_4_;
            if (pFVar15 == (FILE *)0x1) {
              __n = (FILE *)(lVar30 + (ulong)uVar24 + 4);
              RVar13 = ref_export_meshb_next_position((FILE *)local_530,area._0_4_,(REF_FILEPOS)__n)
              ;
              pFStackY_560 = (FILE *)CONCAT44(extraout_var_00,RVar13);
              if (RVar13 != 0) {
                pcVar26 = "next pos";
                uVar25 = 0x7a7;
                goto LAB_001237a4;
              }
              pFVar15 = (FILE *)fwrite(&min_faceid,4,1,local_530);
              if (pFVar15 == (FILE *)0x1) {
                pFVar15 = (FILE *)ftell(local_530);
                if (__n == pFVar15) {
                  iVar9 = pRVar3->n;
                  local_4c8 = (REF_CELL *)(ulong)(uVar24 + (int)local_518);
                  if ((long)iVar9 < 1) {
LAB_00125a6c:
                    local_4bc = uVar11 ^ 3;
                    for (local_500 = (REF_CELL *)0x0; local_500 != (REF_CELL *)0x10;
                        local_500 = (REF_CELL *)((long)local_500 + 1)) {
                      pRVar4 = ref_grid->cell[(long)local_500];
                      if (0 < pRVar4->n) {
                        uVar24 = ref_cell_meshb_keyword(pRVar4,&keyword_code);
                        pFStackY_560 = (FILE *)(ulong)uVar24;
                        if (uVar24 != 0) {
                          pcVar26 = "kw";
                          uVar25 = 0x7ca;
                          goto LAB_001237a4;
                        }
                        iVar9 = pRVar4->node_per;
                        lVar30 = ftell(local_530);
                        iVar29 = pRVar4->n;
                        bVar21 = (byte)local_4bc;
                        local_4d0 = (FILE *)(long)iVar9;
                        pFVar15 = (FILE *)fwrite(&keyword_code,4,1,local_530);
                        if (pFVar15 != (FILE *)0x1) {
                          pcVar26 = "keyword code";
                          uVar25 = 1999;
                          __n = (FILE *)0x1;
                          goto LAB_00124d62;
                        }
                        local_440 = (FILE *)((long)local_4c8 +
                                            (long)iVar29 * (long)(iVar9 + 1 << (bVar21 & 0x1f)) +
                                            lVar30);
                        uVar24 = ref_export_meshb_next_position
                                           ((FILE *)local_530,uVar10,(REF_FILEPOS)local_440);
                        pFStackY_560 = (FILE *)(ulong)uVar24;
                        if (uVar24 != 0) {
                          pcVar26 = "next";
                          uVar25 = 2000;
                          goto LAB_001237a4;
                        }
                        uVar24 = ref_export_meshb_int((FILE *)local_530,uVar10,pRVar4->n);
                        if (uVar24 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x7d1,"ref_export_meshb",(ulong)uVar24,"ncell");
                          goto LAB_00124d69;
                        }
                        iVar9 = 0;
                        uVar33 = 0;
                        if (0 < (int)local_4d0) {
                          uVar33 = (ulong)local_4d0 & 0xffffffff;
                        }
                        pFVar15 = (FILE *)0xffffffffffffffff;
                        if (-1 < (long)local_4d0) {
                          pFVar15 = local_4d0;
                        }
                        for (; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                          RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                          if (RVar13 == 0) {
                            for (uVar31 = 0; RVar28 = nodes[2], RVar1 = nodes[1], uVar33 != uVar31;
                                uVar31 = uVar31 + 1) {
                              nodes[uVar31] = o2n[nodes[uVar31]] + 1;
                            }
                            if (pRVar4->type == REF_CELL_PYR) {
                              nodes[1] = nodes[3];
                              nodes[2] = nodes[4];
                              nodes[3] = RVar1;
                              nodes[4] = RVar28;
                            }
                            if (pRVar4->last_node_is_an_id == 0) {
                              nodes[(long)local_4d0] = 0;
                            }
                            puVar27 = (undefined1 *)0x0;
                            while ((undefined1 *)((long)&pFVar15->_flags + 1) != puVar27) {
                              RVar13 = ref_export_meshb_int
                                                 ((FILE *)local_530,uVar10,nodes[(long)puVar27]);
                              puVar27 = puVar27 + 1;
                              if (RVar13 != 0) {
                                pcVar26 = "c2n";
                                pFStackY_560 = (FILE *)0x1;
                                uVar25 = 0x7e7;
                                goto LAB_001237a4;
                              }
                            }
                          }
                        }
                        pFVar15 = (FILE *)ftell(local_530);
                        if (local_440 != pFVar15) {
                          pcVar26 = "cell inconsistent";
                          uVar25 = 0x7ea;
                          __n = local_440;
                          goto LAB_00124d62;
                        }
                      }
                    }
                    local_500 = (REF_CELL *)0x1;
                    for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
                      uVar20 = 0;
                      uVar31 = (ulong)(uint)pRVar2->max;
                      if (pRVar2->max < 1) {
                        uVar31 = uVar20;
                      }
                      uVar34 = 0;
                      for (; iVar9 = (int)uVar34, uVar31 * 0x18 - uVar20 != 0;
                          uVar20 = uVar20 + 0x18) {
                        uVar34 = (ulong)(iVar9 + (uint)(uVar33 ==
                                                       *(uint *)((long)pRVar2->descr + uVar20)));
                      }
                      if (iVar9 != 0) {
                        keyword_code = (uint)uVar33 | 0x28;
                        lVar30 = ftell(local_530);
                        pFVar15 = (FILE *)fwrite(&keyword_code,4,1,local_530);
                        if (pFVar15 != (FILE *)0x1) {
                          pcVar26 = "keyword";
                          uVar25 = 0x7f7;
                          __n = (FILE *)0x1;
                          goto LAB_00124d62;
                        }
                        local_4d0 = (FILE *)((long)local_4c8 +
                                            ((ulong)(uint)((int)local_518 * 2) + uVar33 * 8 +
                                            (ulong)(uVar33 != 0) * 8) * uVar34 + lVar30);
                        RVar13 = ref_export_meshb_next_position
                                           ((FILE *)local_530,uVar10,(REF_FILEPOS)local_4d0);
                        pFStackY_560 = (FILE *)CONCAT44(extraout_var_03,RVar13);
                        if (RVar13 != 0) {
                          pcVar26 = "next";
                          uVar25 = 0x7f8;
                          goto LAB_001237a4;
                        }
                        RVar13 = ref_export_meshb_int((FILE *)local_530,uVar10,iVar9);
                        if (RVar13 != 0) {
                          pcVar26 = "ngeom";
                          pFStackY_560 = (FILE *)0x1;
                          uVar25 = 0x7f9;
                          goto LAB_001237a4;
                        }
                        local_528 = 0;
                        for (lVar30 = 0; lVar30 < pRVar2->max; lVar30 = lVar30 + 1) {
                          pRVar18 = pRVar2->descr;
                          if (uVar33 == (uint)pRVar18[lVar30 * 6]) {
                            RVar1 = pRVar18[lVar30 * 6 + 1];
                            RVar13 = ref_export_meshb_int
                                               ((FILE *)local_530,uVar10,
                                                o2n[pRVar18[lVar30 * 6 + 5]] + 1);
                            if (RVar13 != 0) {
                              pcVar26 = "node";
                              pFStackY_560 = (FILE *)0x1;
                              uVar25 = 0x7fd;
                              goto LAB_001237a4;
                            }
                            RVar13 = ref_export_meshb_int((FILE *)local_530,uVar10,RVar1);
                            lVar17 = local_528;
                            ppRVar35 = local_500;
                            if (RVar13 != 0) {
                              pcVar26 = "id";
                              pFStackY_560 = (FILE *)0x1;
                              uVar25 = 0x7fe;
                              goto LAB_001237a4;
                            }
                            while (ppRVar35 = (REF_CELL *)((long)ppRVar35 + -1),
                                  ppRVar35 != (REF_CELL *)0x0) {
                              pFVar15 = (FILE *)fwrite((void *)(lVar17 + (long)pRVar2->param),8,1,
                                                       local_530);
                              lVar17 = lVar17 + 8;
                              if (pFVar15 != (FILE *)0x1) {
                                pcVar26 = "id";
                                uVar25 = 0x803;
                                __n = (FILE *)0x1;
                                goto LAB_00124d62;
                              }
                            }
                            if (uVar33 != 0) {
                              o2n_4 = (REF_INT *)(double)pRVar2->descr[lVar30 * 6 + 2];
                              pFVar15 = (FILE *)fwrite(&o2n_4,8,1,local_530);
                              if (pFVar15 != (FILE *)0x1) {
                                pcVar26 = "gref";
                                uVar25 = 0x806;
                                __n = (FILE *)0x1;
                                goto LAB_00124d62;
                              }
                            }
                          }
                          local_528 = local_528 + 0x10;
                        }
                        pFVar15 = (FILE *)ftell(local_530);
                        if (local_4d0 != pFVar15) {
                          pcVar26 = "geom inconsistent";
                          uVar25 = 0x809;
                          __n = local_4d0;
                          goto LAB_00124d62;
                        }
                      }
                      local_500 = (REF_CELL *)((long)local_500 + 1);
                    }
                    RVar6 = pRVar2->cad_data_size;
                    if (RVar6 == 0) {
LAB_001262a4:
                      keyword_code = 0x36;
                      pFVar15 = (FILE *)fwrite(&keyword_code,4,1,local_530);
                      if (pFVar15 == (FILE *)0x1) {
                        uVar10 = ref_export_meshb_next_position((FILE *)local_530,uVar10,0);
                        if (uVar10 == 0) goto LAB_00123714;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x820,"ref_export_meshb",(ulong)uVar10,"next p");
                        pFStackY_560 = (FILE *)(ulong)uVar10;
                        goto LAB_00124d6d;
                      }
                      pcVar26 = "vertex version code";
                      uVar25 = 0x81e;
                      __n = (FILE *)0x1;
                    }
                    else {
                      keyword_code = 0x7e;
                      lVar30 = ftell(local_530);
                      pFVar15 = (FILE *)fwrite(&keyword_code,4,1,local_530);
                      if (pFVar15 == (FILE *)0x1) {
                        next_position = (FILE *)((long)local_4c8 + lVar30 + RVar6);
                        uVar24 = ref_export_meshb_next_position
                                           ((FILE *)local_530,uVar10,(REF_FILEPOS)next_position);
                        pFStackY_560 = (FILE *)(ulong)uVar24;
                        if (uVar24 == 0) {
                          RVar13 = ref_export_meshb_int
                                             ((FILE *)local_530,uVar10,
                                              (REF_INT)pRVar2->cad_data_size);
                          if (RVar13 == 0) {
                            __n = (FILE *)pRVar2->cad_data_size;
                            pFVar15 = (FILE *)fwrite(pRVar2->cad_data,1,(size_t)__n,local_530);
                            if (__n == pFVar15) {
                              pFVar15 = (FILE *)ftell(local_530);
                              if (next_position == pFVar15) goto LAB_001262a4;
                              pcVar26 = "cad_model inconsistent";
                              uVar25 = 0x819;
                              __n = next_position;
                            }
                            else {
                              pcVar26 = "node";
                              uVar25 = 0x818;
                            }
                            goto LAB_00124d62;
                          }
                          pcVar26 = "size in bytes";
                          pFStackY_560 = (FILE *)0x1;
                          uVar25 = 0x814;
                        }
                        else {
                          pcVar26 = "next p";
                          uVar25 = 0x812;
                        }
LAB_001237a4:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,uVar25,"ref_export_meshb",pFStackY_560,pcVar26);
                        goto LAB_00124d6d;
                      }
                      pcVar26 = "keyword";
                      __n = (FILE *)0x1;
                      uVar25 = 0x811;
                    }
                  }
                  else {
                    lVar17 = (long)min_faceid;
                    lVar30 = ftell(local_530);
                    keyword_code = 4;
                    pFVar15 = (FILE *)fwrite(&keyword_code,4,1,local_530);
                    if (pFVar15 == (FILE *)0x1) {
                      __n = (FILE *)((long)local_4c8 +
                                    (local_518 + lVar17 * 8) * (long)iVar9 + lVar30);
                      RVar13 = ref_export_meshb_next_position
                                         ((FILE *)local_530,uVar10,(REF_FILEPOS)__n);
                      pFStackY_560 = (FILE *)CONCAT44(extraout_var_02,RVar13);
                      if (RVar13 == 0) {
                        RVar13 = ref_export_meshb_int((FILE *)local_530,uVar10,pRVar3->n);
                        if (RVar13 == 0) {
                          lVar30 = 0;
                          do {
                            if (pRVar3->n <= lVar30) {
                              pFVar15 = (FILE *)ftell(local_530);
                              if (__n == pFVar15) goto LAB_00125a6c;
                              pcVar26 = "vertex inconsistent";
                              uVar25 = 0x7c5;
                              goto LAB_00124d62;
                            }
                            pFVar15 = (FILE *)fwrite(pRVar3->real +
                                                     (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                                                   lVar30 * 4) * 0xf,8,1,local_530);
                            if (pFVar15 != (FILE *)0x1) {
                              pcVar26 = "x";
                              uVar25 = 0x7b8;
                              __n = (FILE *)0x1;
                              goto LAB_00124d62;
                            }
                            pFVar15 = (FILE *)fwrite(pRVar3->real +
                                                     (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o) +
                                                                   lVar30 * 4) * 0xf + 1,8,1,
                                                     local_530);
                            if (pFVar15 != (FILE *)0x1) {
                              pcVar26 = "y";
                              uVar25 = 0x7bc;
                              __n = (FILE *)0x1;
                              goto LAB_00124d62;
                            }
                            if ((ref_grid->twod == 0) &&
                               (pFVar15 = (FILE *)fwrite(pRVar3->real +
                                                         (long)*(int *)(CONCAT44(n2o._4_4_,(int)n2o)
                                                                       + lVar30 * 4) * 0xf + 2,8,1,
                                                         local_530), pFVar15 != (FILE *)0x1)) {
                              pcVar26 = "z";
                              pFStackY_560 = (FILE *)0x1;
                              uVar25 = 0x7c1;
                              __n = pFStackY_560;
                              goto LAB_00124d62;
                            }
                            RVar13 = ref_export_meshb_int((FILE *)local_530,uVar10,1);
                            lVar30 = lVar30 + 1;
                          } while (RVar13 == 0);
                          pcVar26 = "nnode";
                          pFStackY_560 = (FILE *)0x1;
                          uVar25 = 0x7c3;
                        }
                        else {
                          pcVar26 = "nnode";
                          pFStackY_560 = (FILE *)0x1;
                          uVar25 = 0x7b3;
                        }
                      }
                      else {
                        pcVar26 = "next p";
                        uVar25 = 0x7b2;
                      }
                      goto LAB_001237a4;
                    }
                    pcVar26 = "vertex version code";
                    __n = (FILE *)0x1;
                    uVar25 = 0x7b1;
                  }
                }
                else {
                  pcVar26 = "dim inconsistent";
                  uVar25 = 0x7a9;
                }
              }
              else {
                pcVar26 = "dim";
                __n = (FILE *)0x1;
                uVar25 = 0x7a8;
              }
            }
            else {
              pcVar26 = "dim code";
              __n = (FILE *)0x1;
              uVar25 = 0x7a6;
            }
          }
          else {
            pcVar26 = "version";
            __n = (FILE *)0x1;
            uVar25 = 0x7a3;
          }
        }
        else {
          pcVar26 = "code";
          __n = (FILE *)0x1;
          uVar25 = 0x7a2;
        }
LAB_00124d62:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_meshb",pcVar26,__n,pFVar15);
LAB_00124d69:
        pFStackY_560 = (FILE *)0x1;
      }
LAB_00124d6d:
      pcVar26 = "meshb export failed";
      uVar25 = 0xacc;
      goto LAB_00120b71;
    }
    iVar9 = strcmp(pcVar36 + -9,"-bamg.msh");
    if (iVar9 == 0) {
      if (ref_grid->twod == 0) {
        pcVar26 = "expected twod convention grid";
        uVar25 = 0x836;
LAB_00124301:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_bamg_msh",pcVar26);
        pFStackY_560 = (FILE *)0x1;
LAB_00124cbe:
        local_518 = (ulong)pFStackY_560;
      }
      else {
        pRVar3 = ref_grid->node;
        local_530 = fopen(filename,"w");
        if (local_530 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          pcVar26 = "unable to open file";
          uVar25 = 0x83a;
          goto LAB_00124cb5;
        }
        fwrite("MeshVersionFormatted 0\n\n",0x18,1,local_530);
        fwrite("Dimension 2\n\n",0xd,1,local_530);
        lVar30 = (long)pRVar3->max;
        if (lVar30 < 0) {
          pcVar26 = "malloc o2n of REF_INT negative";
          uVar25 = 0x83f;
          goto LAB_00124301;
        }
        pvVar16 = malloc(lVar30 * 4);
        if (pvVar16 == (void *)0x0) {
          pcVar26 = "malloc o2n of REF_INT NULL";
          uVar25 = 0x83f;
LAB_00124cb5:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 uVar25,"ref_export_bamg_msh",pcVar26);
          pFStackY_560 = (FILE *)0x2;
          goto LAB_00124cbe;
        }
        for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
          *(undefined4 *)((long)pvVar16 + lVar17 * 4) = 0xffffffff;
        }
        pvVar19 = malloc(lVar30 * 4);
        if (pvVar19 == (void *)0x0) {
          pcVar26 = "malloc n2o of REF_INT NULL";
          uVar25 = 0x840;
          goto LAB_00124cb5;
        }
        for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
          *(undefined4 *)((long)pvVar19 + lVar17 * 4) = 0xffffffff;
        }
        uVar10 = 0;
        for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
          if (-1 < pRVar3->global[lVar17]) {
            *(uint *)((long)pvVar16 + lVar17 * 4) = uVar10;
            *(int *)((long)pvVar19 + (long)(int)uVar10 * 4) = (int)lVar17;
            uVar10 = uVar10 + 1;
          }
        }
        uVar31 = 0;
        fprintf(local_530,"\nVertices\n%d\n",(ulong)uVar10);
        uVar33 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar33 = uVar31;
        }
        local_518 = 1;
        for (; uVar33 != uVar31; uVar31 = uVar31 + 1) {
          lVar30 = (long)*(int *)((long)pvVar19 + uVar31 * 4);
          fprintf(local_530,"%.16E %.16E %d\n",pRVar3->real[lVar30 * 0xf],
                  pRVar3->real[lVar30 * 0xf + 2],1);
        }
        pRVar4 = ref_grid->cell[0];
        fprintf(local_530,"\nEdges\n%d\n",(ulong)(uint)pRVar4->n);
        iVar29 = 0;
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
          if (RVar13 == 0) {
            iVar29 = iVar29 + 1;
            fprintf(local_530,"%d %d %d\n",(ulong)(*(int *)((long)pvVar16 + (long)nodes[0] * 4) + 1)
                    ,(ulong)(*(int *)((long)pvVar16 + (long)nodes[1] * 4) + 1),(ulong)(uint)nodes[2]
                   );
          }
        }
        iVar9 = pRVar4->n;
        if (iVar29 == iVar9) {
          pRVar4 = ref_grid->cell[3];
          fprintf(local_530,"\nTriangles\n%d\n",(ulong)(uint)pRVar4->n);
          iVar29 = 0;
          for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
            RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
            if (RVar13 == 0) {
              iVar29 = iVar29 + 1;
              fprintf(local_530,"%d %d %d %d\n",
                      (ulong)(*(int *)((long)pvVar16 + (long)nodes[0] * 4) + 1),
                      (ulong)(*(int *)((long)pvVar16 + (long)nodes[2] * 4) + 1),
                      (ulong)(*(int *)((long)pvVar16 + (long)nodes[1] * 4) + 1),
                      (ulong)(uint)nodes[3]);
            }
          }
          iVar9 = pRVar4->n;
          if (iVar29 == iVar9) {
            free(pvVar19);
            goto LAB_00124f3f;
          }
          pcVar26 = "triangle miscount";
          uVar25 = 0x860;
        }
        else {
          pcVar26 = "edge/quad miscount";
          uVar25 = 0x856;
        }
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_bamg_msh",pcVar26,(long)iVar29,(long)iVar9);
      }
      pcVar26 = "bamg msh export failed";
      uVar25 = 0xace;
      pFStackY_560 = (FILE *)local_518;
      goto LAB_00120b71;
    }
    iVar9 = strcmp(pcVar26,".msh");
    if (iVar9 != 0) {
      iVar9 = strcmp(__s1_00,".msh2");
      if (iVar9 != 0) {
        iVar9 = strcmp(pcVar26,".tri");
        if (iVar9 != 0) {
          uVar10 = ref_gather_by_extension(ref_grid,filename);
          pFStackY_560 = (FILE *)(ulong)uVar10;
          if (uVar10 == 0) {
            return 0;
          }
          pcVar26 = "export via gather";
          uVar25 = 0xad6;
          goto LAB_00120b71;
        }
        pFStackY_560 = (FILE *)0x2;
        pRVar3 = ref_grid->node;
        pRVar4 = ref_grid->cell[3];
        local_530 = fopen(filename,"w");
        if (local_530 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          pcVar26 = "unable to open file";
          uVar25 = 0xa11;
        }
        else {
          lVar30 = (long)pRVar3->max;
          if (lVar30 < 0) {
            pFStackY_560 = (FILE *)0x1;
            pcVar26 = "malloc o2n of REF_INT negative";
          }
          else {
            pvVar16 = malloc(lVar30 * 4);
            if (pvVar16 != (void *)0x0) {
              for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
                *(undefined4 *)((long)pvVar16 + lVar17 * 4) = 0xffffffff;
              }
              pvVar19 = malloc(lVar30 * 4);
              if (pvVar19 != (void *)0x0) {
                for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
                  *(undefined4 *)((long)pvVar19 + lVar17 * 4) = 0xffffffff;
                }
                uVar10 = 0;
                for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
                  if (((-1 < pRVar3->global[lVar17]) && (lVar17 < pRVar4->ref_adj->nnode)) &&
                     (pRVar4->ref_adj->first[lVar17] != -1)) {
                    *(uint *)((long)pvVar16 + lVar17 * 4) = uVar10;
                    *(int *)((long)pvVar19 + (long)(int)uVar10 * 4) = (int)lVar17;
                    uVar10 = uVar10 + 1;
                  }
                }
                uVar31 = 0;
                fprintf(local_530,"%d %d\n",(ulong)uVar10,(ulong)(uint)pRVar4->n);
                uVar33 = (ulong)uVar10;
                if ((int)uVar10 < 1) {
                  uVar33 = uVar31;
                }
                for (; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                  pRVar5 = pRVar3->real;
                  lVar30 = (long)*(int *)((long)pvVar19 + uVar31 * 4);
                  fprintf(local_530,"%.16E %.16E %.16E\n",pRVar5[lVar30 * 0xf],
                          pRVar5[lVar30 * 0xf + 1],pRVar5[lVar30 * 0xf + 2]);
                }
                for (iVar9 = 0; iVar29 = pRVar4->max, iVar9 < iVar29; iVar9 = iVar9 + 1) {
                  RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                  if (RVar13 == 0) {
                    fprintf(local_530,"%d %d %d\n",
                            (ulong)(*(int *)((long)pvVar16 + (long)nodes[0] * 4) + 1),
                            (ulong)(*(int *)((long)pvVar16 + (long)nodes[1] * 4) + 1),
                            (ulong)(*(int *)((long)pvVar16 + (long)nodes[2] * 4) + 1));
                  }
                }
                for (iVar9 = 0; iVar9 < iVar29; iVar9 = iVar9 + 1) {
                  RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                  if (RVar13 == 0) {
                    fprintf(local_530,"%d\n",(ulong)(uint)nodes[3]);
                  }
                  iVar29 = pRVar4->max;
                }
                free(pvVar19);
LAB_00124f3f:
                free(pvVar16);
                goto LAB_0012372e;
              }
              pcVar26 = "malloc n2o of REF_INT NULL";
              uVar25 = 0xa14;
              goto LAB_00124f6f;
            }
            pcVar26 = "malloc o2n of REF_INT NULL";
          }
          uVar25 = 0xa13;
        }
LAB_00124f6f:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_tri",pcVar26);
        pcVar26 = "tri export failed";
        uVar25 = 0xad4;
        goto LAB_00120b71;
      }
      pRVar3 = ref_grid->node;
      local_530 = fopen(filename,"w");
      if (local_530 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar26 = "unable to open file";
        uVar25 = 0x950;
LAB_00124c3e:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_msh2",pcVar26);
        pFStackY_560 = (FILE *)0x2;
      }
      else {
        fprintf(local_530,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x400199999999999a,0,8);
        lVar30 = (long)pRVar3->max;
        if (-1 < lVar30) {
          local_520 = malloc(lVar30 * 4);
          if (local_520 != (void *)0x0) {
            for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
              *(undefined4 *)((long)local_520 + lVar17 * 4) = 0xffffffff;
            }
            uVar10 = 0;
            for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
              if (-1 < pRVar3->global[lVar17]) {
                *(int *)((long)local_520 + (long)(int)uVar10 * 4) = (int)lVar17;
                uVar10 = uVar10 + 1;
              }
            }
            uVar31 = 0;
            fprintf(local_530,"$Nodes\n%d\n",(ulong)uVar10);
            uVar33 = (ulong)uVar10;
            if ((int)uVar10 < 1) {
              uVar33 = uVar31;
            }
            while (uVar33 != uVar31) {
              pRVar5 = pRVar3->real;
              lVar30 = (long)*(int *)((long)local_520 + uVar31 * 4);
              uVar31 = uVar31 + 1;
              fprintf(local_530,"%d %.16E %.16E %.16E\n",pRVar5[lVar30 * 0xf],
                      pRVar5[lVar30 * 0xf + 1],pRVar5[lVar30 * 0xf + 2],uVar31 & 0xffffffff);
            }
            fwrite("$EndNodes\n",10,1,local_530);
            uVar33 = 0;
            for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
              iVar9 = ref_grid->cell[lVar30]->n;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              uVar33 = (ulong)(uint)((int)uVar33 + iVar9);
            }
            fprintf(local_530,"$Elements\n%d\n",uVar33);
            uVar10 = 0;
            for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
              pRVar4 = ref_grid->cell[lVar30];
              if (0 < pRVar4->n) {
                uVar41 = 0xffffffff;
                switch(pRVar4->type) {
                case REF_CELL_EDG:
                  uVar41 = 1;
                  break;
                case REF_CELL_ED2:
                  uVar41 = 8;
                  break;
                case REF_CELL_ED3:
                  uVar41 = 0x1a;
                  break;
                case REF_CELL_TRI:
                  uVar41 = 2;
                  break;
                case REF_CELL_TR2:
                  uVar41 = 9;
                  break;
                case REF_CELL_TR3:
                  uVar41 = 0x15;
                  break;
                case REF_CELL_QUA:
                  uVar41 = 3;
                  break;
                case REF_CELL_QU2:
                case REF_CELL_PY2:
                case REF_CELL_PR2:
                case REF_CELL_HE2:
                  pFStackY_560 = (FILE *)0x6;
                  goto LAB_00124c47;
                case REF_CELL_TET:
                  uVar41 = 4;
                  break;
                case REF_CELL_PYR:
                  uVar41 = 7;
                  break;
                case REF_CELL_PRI:
                  uVar41 = 6;
                  break;
                case REF_CELL_HEX:
                  uVar41 = 5;
                  break;
                case REF_CELL_TE2:
                  uVar41 = 0xb;
                }
                for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                  RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                  RVar1 = nodes[0];
                  if (RVar13 == 0) {
                    RVar12 = pRVar4->type;
                    if (RVar12 == REF_CELL_PYR) {
                      RVar28 = nodes[1];
                      RVar39 = nodes[2];
                      nodes[1] = nodes[3];
                      nodes[2] = nodes[4];
                      RVar12 = pRVar4->type;
                      nodes[3] = RVar28;
                      nodes[4] = RVar39;
                    }
                    RVar8 = nodes[4];
                    RVar39 = nodes[3];
                    RVar28 = nodes[1];
                    if (RVar12 == REF_CELL_TE2) {
                      RVar12 = pRVar4->type;
                    }
                    if (RVar12 == REF_CELL_TRI) {
                      nodes[0] = nodes[2];
                      nodes[2] = RVar1;
                      RVar12 = pRVar4->type;
                    }
                    RVar7 = nodes[2];
                    RVar1 = nodes[0];
                    nodes[0] = RVar1;
                    nodes[2] = RVar7;
                    if (RVar12 == REF_CELL_TR2) {
                      nodes[0] = nodes[2];
                      nodes[2] = RVar1;
                      nodes[3] = nodes[4];
                      nodes[4] = RVar39;
                      RVar12 = pRVar4->type;
                      if (RVar12 == REF_CELL_TR2) {
                        nodes[3] = nodes[6];
                        nodes[4] = nodes[5];
                        nodes[5] = RVar8;
                        nodes[6] = RVar39;
                        RVar12 = pRVar4->type;
                        nodes[0] = RVar1;
                        nodes[2] = RVar7;
                      }
                    }
                    RVar1 = nodes[0];
                    if (RVar12 == REF_CELL_QUA) {
                      nodes[0] = nodes[1];
                      nodes[1] = nodes[2];
                      nodes[2] = RVar28;
                      nodes[3] = RVar1;
                    }
                    uVar10 = uVar10 + 1;
                    fprintf(local_530,"%d %d %d",(ulong)uVar10,uVar41,2);
                    if (pRVar4->last_node_is_an_id == 0) {
                      uVar31 = 0;
                      uVar33 = 0;
                    }
                    else {
                      uVar33 = (ulong)(uint)nodes[pRVar4->node_per];
                      uVar31 = (ulong)(uint)nodes[pRVar4->node_per];
                    }
                    fprintf(local_530," %d %d",uVar31,uVar33);
                    for (lVar17 = 0; lVar17 < pRVar4->node_per; lVar17 = lVar17 + 1) {
                      fprintf(local_530," %d",(ulong)(nodes[lVar17] + 1));
                    }
                    fputc(10,local_530);
                  }
                }
              }
            }
            goto LAB_00124994;
          }
          pcVar26 = "malloc n2o of REF_INT NULL";
          uVar25 = 0x956;
          goto LAB_00124c3e;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x955,"ref_export_msh2","malloc o2n of REF_INT negative");
        pFStackY_560 = (FILE *)0x1;
      }
LAB_00124c47:
      pcVar26 = "msh2 export failed";
      uVar25 = 0xad2;
      goto LAB_00120b71;
    }
    pRVar3 = ref_grid->node;
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar26 = "unable to open file";
      uVar25 = 0x87f;
LAB_00124ad2:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar25,"ref_export_msh",pcVar26);
      pFStackY_560 = (FILE *)0x2;
    }
    else {
      fprintf(local_530,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x4010666666666666,0,8);
      lVar30 = (long)pRVar3->max;
      if (-1 < lVar30) {
        local_520 = malloc(lVar30 * 4);
        if (local_520 != (void *)0x0) {
          for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
            *(undefined4 *)((long)local_520 + lVar17 * 4) = 0xffffffff;
          }
          uVar10 = 0;
          for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
            if (-1 < pRVar3->global[lVar17]) {
              *(int *)((long)local_520 + (long)(int)uVar10 * 4) = (int)lVar17;
              uVar10 = uVar10 + 1;
            }
          }
          fprintf(local_530,"$Nodes\n1 %d 1 %d\n%d 1 0 %d\n",(ulong)uVar10,(ulong)uVar10,3);
          uVar24 = 0;
          if (0 < (int)uVar10) {
            uVar24 = uVar10;
          }
          for (uVar10 = 1; uVar10 - uVar24 != 1; uVar10 = uVar10 + 1) {
            fprintf(local_530,"%d\n",(ulong)uVar10);
          }
          for (uVar33 = 0; uVar24 != uVar33; uVar33 = uVar33 + 1) {
            pRVar5 = pRVar3->real;
            lVar30 = (long)*(int *)((long)local_520 + uVar33 * 4);
            fprintf(local_530,"%.16E %.16E %.16E\n",pRVar5[lVar30 * 0xf],pRVar5[lVar30 * 0xf + 1],
                    pRVar5[lVar30 * 0xf + 2]);
          }
          fwrite("$EndNodes\n",10,1,local_530);
          iVar9 = 0;
          uVar33 = 0;
          uVar31 = 0;
          for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
            iVar29 = ref_grid->cell[lVar30]->n;
            iVar37 = iVar29;
            if (iVar29 < iVar9) {
              iVar37 = iVar9;
            }
            iVar32 = iVar29;
            if (iVar29 < 1) {
              iVar32 = 0;
              iVar37 = iVar9;
            }
            iVar9 = iVar37;
            uVar33 = (ulong)(uint)((int)uVar33 + iVar32);
            uVar31 = (ulong)((int)uVar31 + (uint)(0 < iVar29));
          }
          fprintf(local_530,"$Elements\n%d %d %d %d\n",uVar31,uVar33,1);
          uVar10 = 0;
          for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
            pRVar4 = ref_grid->cell[lVar30];
            if (0 < pRVar4->n) {
              pFStackY_560 = (FILE *)0xffffffffffffffff;
              switch(pRVar4->type) {
              case REF_CELL_EDG:
                pFStackY_560 = (FILE *)0x1;
                break;
              case REF_CELL_ED2:
                pFStackY_560 = (FILE *)0x8;
                break;
              case REF_CELL_ED3:
                pFStackY_560 = (FILE *)0x1a;
                break;
              case REF_CELL_TRI:
                pFStackY_560 = (FILE *)0x2;
                break;
              case REF_CELL_TR2:
                pFStackY_560 = (FILE *)0x9;
                break;
              case REF_CELL_TR3:
                pFStackY_560 = (FILE *)0x15;
                break;
              case REF_CELL_QUA:
                pFStackY_560 = (FILE *)0x3;
                break;
              case REF_CELL_QU2:
              case REF_CELL_PY2:
              case REF_CELL_PR2:
              case REF_CELL_HE2:
                pFStackY_560 = (FILE *)0x6;
                goto LAB_00124adb;
              case REF_CELL_TET:
                pFStackY_560 = (FILE *)0x4;
                break;
              case REF_CELL_PYR:
                pFStackY_560 = (FILE *)0x7;
                break;
              case REF_CELL_PRI:
                pFStackY_560 = (FILE *)0x6;
                break;
              case REF_CELL_HEX:
                pFStackY_560 = (FILE *)0x5;
                break;
              case REF_CELL_TE2:
                pFStackY_560 = (FILE *)0xb;
              }
              uVar10 = uVar10 + 1;
              fprintf(local_530,"%d %d %d %d\n",(ulong)uVar10,1,pFStackY_560);
              iVar9 = 0;
              for (iVar29 = 0; iVar29 < pRVar4->max; iVar29 = iVar29 + 1) {
                RVar13 = ref_cell_nodes(pRVar4,iVar29,nodes);
                RVar39 = nodes[2];
                RVar28 = nodes[1];
                RVar1 = nodes[0];
                if (RVar13 == 0) {
                  RVar12 = pRVar4->type;
                  if (RVar12 == REF_CELL_PYR) {
                    nodes[1] = nodes[3];
                    nodes[2] = nodes[4];
                    nodes[3] = RVar28;
                    nodes[4] = RVar39;
                    RVar12 = pRVar4->type;
                  }
                  RVar8 = nodes[4];
                  RVar39 = nodes[3];
                  RVar28 = nodes[1];
                  if (RVar12 == REF_CELL_TE2) {
                    RVar12 = pRVar4->type;
                  }
                  if (RVar12 == REF_CELL_TRI) {
                    nodes[0] = nodes[2];
                    nodes[2] = RVar1;
                    RVar12 = pRVar4->type;
                  }
                  RVar7 = nodes[2];
                  RVar1 = nodes[0];
                  if (RVar12 == REF_CELL_TR2) {
                    nodes[0] = nodes[2];
                    nodes[2] = RVar1;
                    nodes[3] = nodes[4];
                    nodes[4] = RVar39;
                    RVar12 = pRVar4->type;
                    if (RVar12 == REF_CELL_TR2) {
                      nodes[0] = RVar1;
                      nodes[2] = RVar7;
                      nodes[3] = nodes[6];
                      nodes[4] = nodes[5];
                      nodes[5] = RVar8;
                      nodes[6] = RVar39;
                      RVar12 = pRVar4->type;
                    }
                  }
                  RVar1 = nodes[0];
                  if (RVar12 == REF_CELL_QUA) {
                    nodes[0] = nodes[1];
                    nodes[1] = nodes[2];
                    nodes[2] = RVar28;
                    nodes[3] = RVar1;
                  }
                  if (pRVar4->last_node_is_an_id == 0) {
                    uVar24 = iVar9 + 1;
                  }
                  else {
                    uVar24 = nodes[pRVar4->node_per];
                  }
                  fprintf(local_530,"%d",(ulong)uVar24);
                  for (lVar17 = 0; lVar17 < pRVar4->node_per; lVar17 = lVar17 + 1) {
                    fprintf(local_530," %d",(ulong)(nodes[lVar17] + 1));
                  }
                  fputc(10,local_530);
                  iVar9 = iVar9 + 1;
                }
              }
            }
          }
LAB_00124994:
          fwrite("$EndElements\n",0xd,1,local_530);
          free(local_520);
          goto LAB_0012372e;
        }
        pcVar26 = "malloc n2o of REF_INT NULL";
        uVar25 = 0x885;
        goto LAB_00124ad2;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x884,"ref_export_msh","malloc o2n of REF_INT negative");
      pFStackY_560 = (FILE *)0x1;
    }
LAB_00124adb:
    pcVar26 = "msh export failed";
    uVar25 = 0xad0;
    goto LAB_00120b71;
  }
  if (ref_grid->twod == 0) {
    pcVar26 = "expected twod convention grid";
    uVar25 = 0xa42;
LAB_001226af:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar25
           ,"ref_export_i_like_cfd_grid",pcVar26);
LAB_001226b6:
    pFStackY_560 = (FILE *)0x1;
  }
  else {
    pRVar3 = ref_grid->node;
    local_530 = fopen(filename,"w");
    if (local_530 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar26 = "unable to open file";
      uVar25 = 0xa46;
      goto LAB_00122f80;
    }
    lVar30 = (long)pRVar3->max;
    if (lVar30 < 0) {
      pcVar26 = "malloc o2n of REF_INT negative";
      uVar25 = 0xa48;
      goto LAB_001226af;
    }
    pvVar16 = malloc(lVar30 * 4);
    if (pvVar16 == (void *)0x0) {
      pcVar26 = "malloc o2n of REF_INT NULL";
      uVar25 = 0xa48;
    }
    else {
      for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
        *(undefined4 *)((long)pvVar16 + lVar17 * 4) = 0xffffffff;
      }
      pvVar19 = malloc(lVar30 * 4);
      if (pvVar19 != (void *)0x0) {
        for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
          *(undefined4 *)((long)pvVar19 + lVar17 * 4) = 0xffffffff;
        }
        uVar10 = 0;
        for (lVar17 = 0; lVar30 != lVar17; lVar17 = lVar17 + 1) {
          if (-1 < pRVar3->global[lVar17]) {
            *(uint *)((long)pvVar16 + lVar17 * 4) = uVar10;
            *(int *)((long)pvVar19 + (long)(int)uVar10 * 4) = (int)lVar17;
            uVar10 = uVar10 + 1;
          }
        }
        uVar31 = 0;
        fprintf(local_530,"%d %d %d\n",(ulong)uVar10,(ulong)(uint)ref_grid->cell[3]->n,
                (ulong)(uint)ref_grid->cell[6]->n);
        uVar33 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar33 = uVar31;
        }
        for (; uVar33 != uVar31; uVar31 = uVar31 + 1) {
          lVar30 = (long)*(int *)((long)pvVar19 + uVar31 * 4);
          fprintf(local_530,"%.16E %.16E\n",pRVar3->real[lVar30 * 0xf],
                  pRVar3->real[lVar30 * 0xf + 1]);
        }
        pRVar4 = ref_grid->cell[3];
        iVar29 = 0;
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
          if (RVar13 == 0) {
            iVar29 = iVar29 + 1;
            fprintf(local_530,"%d %d %d\n",(ulong)(*(int *)((long)pvVar16 + (long)nodes[0] * 4) + 1)
                    ,(ulong)(*(int *)((long)pvVar16 + (long)nodes[1] * 4) + 1),
                    (ulong)(*(int *)((long)pvVar16 + (long)nodes[2] * 4) + 1));
          }
        }
        lVar30 = (long)pRVar4->n;
        if (iVar29 != pRVar4->n) {
          lVar17 = (long)iVar29;
          pcVar26 = "triangle miscount";
          uVar25 = 0xa61;
LAB_001231b4:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 uVar25,"ref_export_i_like_cfd_grid",pcVar26,lVar17,lVar30);
          goto LAB_001226b6;
        }
        pRVar4 = ref_grid->cell[6];
        for (iVar9 = 0; iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
          RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
          if (RVar13 == 0) {
            fprintf(local_530,"%d %d %d %d\n",
                    (ulong)(*(int *)((long)pvVar16 + (long)nodes[0] * 4) + 1),
                    (ulong)(*(int *)((long)pvVar16 + (long)nodes[1] * 4) + 1),
                    (ulong)(*(int *)((long)pvVar16 + (long)nodes[2] * 4) + 1));
          }
        }
        lVar30 = (long)pRVar4->n;
        if (lVar30 != 0) {
          pcVar26 = "quad miscount";
          uVar25 = 0xa6a;
          lVar17 = 0;
          goto LAB_001231b4;
        }
        pRVar4 = ref_grid->cell[0];
        uVar10 = ref_cell_id_range(pRVar4,ref_grid->mpi,(REF_INT *)&o2n,(REF_INT *)&n2o);
        pFStackY_560 = (FILE *)(ulong)uVar10;
        if (uVar10 == 0) {
          fprintf(local_530,"%d\n",(ulong)(((int)n2o - (int)o2n) + 1));
          for (iVar9 = (int)o2n; iVar29 = (int)n2o, iVar9 <= (int)n2o; iVar9 = iVar9 + 1) {
            iVar29 = 0;
            for (iVar37 = 0; iVar37 < pRVar4->max; iVar37 = iVar37 + 1) {
              RVar13 = ref_cell_nodes(pRVar4,iVar37,nodes);
              iVar29 = iVar29 + (uint)(nodes[2] == iVar9 && RVar13 == 0);
            }
            fprintf(local_530,"%d\n",(ulong)(iVar29 + 1));
          }
          uVar10 = pRVar4->n;
          if ((int)uVar10 < 0) {
            pcVar26 = "malloc c2n of REF_INT negative";
            uVar25 = 0xa7a;
            goto LAB_001226af;
          }
          pRVar18 = (REF_INT *)malloc((ulong)uVar10 * 8);
          if (pRVar18 == (REF_INT *)0x0) {
            pcVar26 = "malloc c2n of REF_INT NULL";
            uVar25 = 0xa7a;
          }
          else {
            local_500 = (REF_CELL *)malloc((ulong)uVar10 << 2);
            if (local_500 != (REF_CELL *)0x0) {
              for (local_520._0_4_ = (int)o2n; (int)local_520 <= iVar29;
                  local_520._0_4_ = (int)local_520 + 1) {
                uVar33 = 0;
                for (iVar9 = 0; iVar29 = (int)uVar33, iVar9 < pRVar4->max; iVar9 = iVar9 + 1) {
                  RVar13 = ref_cell_nodes(pRVar4,iVar9,nodes);
                  if ((RVar13 == 0) && (nodes[2] == (int)local_520)) {
                    RVar13 = ref_grid_orient_edg(ref_grid,nodes);
                    pFStackY_560 = (FILE *)CONCAT44(extraout_var_01,RVar13);
                    if (RVar13 != 0) {
                      pcVar26 = "orient based on tri";
                      uVar25 = 0xa80;
                      goto LAB_00123b80;
                    }
                    *(ulong *)(pRVar18 + iVar29 * 2) = CONCAT44(nodes[1],nodes[0]);
                    uVar33 = (ulong)(iVar29 + 1);
                  }
                }
                if (0 < iVar29) {
                  RVar13 = ref_export_order_segments(iVar29,pRVar18,(REF_INT *)local_500);
                  if (RVar13 != 0) {
                    pcVar26 = "order";
                    pFStackY_560 = (FILE *)0x1;
                    uVar25 = 0xa87;
                    goto LAB_00123b80;
                  }
                  fprintf(local_530,"%d\n",
                          (ulong)(*(int *)((long)pvVar16 +
                                          (long)pRVar18[(long)*(int *)local_500 * 2] * 4) + 1));
                  for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
                    fprintf(local_530,"%d\n",
                            (ulong)(*(int *)((long)pvVar16 +
                                            (long)pRVar18[(long)*(int *)((long)local_500 +
                                                                        uVar31 * 4) * 2 + 1] * 4) +
                                   1));
                  }
                }
                iVar29 = (int)n2o;
              }
              free(local_500);
              free(pRVar18);
              free(pvVar19);
              free(pvVar16);
              goto LAB_0012372e;
            }
            pcVar26 = "malloc order of REF_INT NULL";
            uVar25 = 0xa7b;
          }
          goto LAB_00122f80;
        }
        pcVar26 = "id range";
        uVar25 = 0xa6e;
LAB_00123b80:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar25,"ref_export_i_like_cfd_grid",pFStackY_560,pcVar26);
        goto LAB_00122f8b;
      }
      pcVar26 = "malloc n2o of REF_INT NULL";
      uVar25 = 0xa49;
    }
LAB_00122f80:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar25
           ,"ref_export_i_like_cfd_grid",pcVar26);
    pFStackY_560 = (FILE *)0x2;
  }
LAB_00122f8b:
  pcVar26 = "grid export failed";
  uVar25 = 0xac2;
LAB_00120b71:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar25,
         "ref_export_by_extension",(ulong)pFStackY_560 & 0xffffffff,pcVar26);
  return (REF_STATUS)pFStackY_560;
}

Assistant:

REF_FCN REF_STATUS ref_export_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 4], ".vtk") == 0) {
    RSS(ref_export_vtk(ref_grid, filename), "vtk export failed");
  } else if (strcmp(&filename[end_of_string - 2], ".c") == 0) {
    RSS(ref_export_c(ref_grid, filename), "C export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tec") == 0) {
    RSS(ref_export_tec(ref_grid, filename), "tec export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_by_extension(ref_grid, filename), "plt gather failed");
  } else if (strcmp(&filename[end_of_string - 4], ".eps") == 0) {
    RSS(ref_export_eps(ref_grid, filename), "eps export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".pdf") == 0) {
    RSS(ref_export_pdf(ref_grid, filename), "pdf export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_export_su2(ref_grid, filename), "su2 export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        "lb8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        "b8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_export_ugrid(ref_grid, filename), "ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_export_i_like_cfd_grid(ref_grid, filename), "grid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".poly") == 0) {
    RSS(ref_export_poly(ref_grid, filename), "poly export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".smesh") == 0) {
    RSS(ref_export_smesh(ref_grid, filename), "smesh export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_export_fgrid(ref_grid, filename), "fgrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".html") == 0) {
    RSS(ref_export_html(ref_grid, filename), "html export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_export_meshb(ref_grid, filename), "meshb export failed");
  } else if (strcmp(&filename[end_of_string - 9], "-bamg.msh") == 0) {
    RSS(ref_export_bamg_msh(ref_grid, filename), "bamg msh export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_export_msh(ref_grid, filename), "msh export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".msh2") == 0) {
    RSS(ref_export_msh2(ref_grid, filename), "msh2 export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_export_tri(ref_grid, filename), "tri export failed");
  } else {
    RSS(ref_gather_by_extension(ref_grid, filename), "export via gather");
  }

  return REF_SUCCESS;
}